

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O0

void fadst8x16_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined8 uVar221;
  undefined8 uVar222;
  undefined8 uVar223;
  undefined8 uVar224;
  undefined8 uVar225;
  undefined8 uVar226;
  undefined8 uVar227;
  undefined8 uVar228;
  undefined8 uVar229;
  undefined8 uVar230;
  undefined8 uVar231;
  undefined8 uVar232;
  undefined8 uVar233;
  undefined8 uVar234;
  int iVar235;
  undefined4 uVar236;
  int iVar237;
  uint uVar238;
  int iVar239;
  uint uVar240;
  uint uVar241;
  int iVar242;
  uint uVar243;
  int iVar244;
  uint uVar245;
  int iVar246;
  uint uVar247;
  int iVar248;
  uint uVar249;
  int iVar250;
  uint uVar251;
  int iVar252;
  uint uVar253;
  int iVar254;
  uint uVar255;
  int iVar256;
  int32_t *piVar257;
  char in_DL;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  __m128i d1_19;
  __m128i d0_19;
  __m128i c1_19;
  __m128i c0_19;
  __m128i b1_19;
  __m128i b0_19;
  __m128i a1_19;
  __m128i a0_19;
  __m128i v1_19;
  __m128i v0_19;
  __m128i u1_19;
  __m128i u0_19;
  __m128i t1_19;
  __m128i t0_19;
  __m128i d1_18;
  __m128i d0_18;
  __m128i c1_18;
  __m128i c0_18;
  __m128i b1_18;
  __m128i b0_18;
  __m128i a1_18;
  __m128i a0_18;
  __m128i v1_18;
  __m128i v0_18;
  __m128i u1_18;
  __m128i u0_18;
  __m128i t1_18;
  __m128i t0_18;
  __m128i d1_17;
  __m128i d0_17;
  __m128i c1_17;
  __m128i c0_17;
  __m128i b1_17;
  __m128i b0_17;
  __m128i a1_17;
  __m128i a0_17;
  __m128i v1_17;
  __m128i v0_17;
  __m128i u1_17;
  __m128i u0_17;
  __m128i t1_17;
  __m128i t0_17;
  __m128i d1_16;
  __m128i d0_16;
  __m128i c1_16;
  __m128i c0_16;
  __m128i b1_16;
  __m128i b0_16;
  __m128i a1_16;
  __m128i a0_16;
  __m128i v1_16;
  __m128i v0_16;
  __m128i u1_16;
  __m128i u0_16;
  __m128i t1_16;
  __m128i t0_16;
  __m128i d1_15;
  __m128i d0_15;
  __m128i c1_15;
  __m128i c0_15;
  __m128i b1_15;
  __m128i b0_15;
  __m128i a1_15;
  __m128i a0_15;
  __m128i v1_15;
  __m128i v0_15;
  __m128i u1_15;
  __m128i u0_15;
  __m128i t1_15;
  __m128i t0_15;
  __m128i d1_14;
  __m128i d0_14;
  __m128i c1_14;
  __m128i c0_14;
  __m128i b1_14;
  __m128i b0_14;
  __m128i a1_14;
  __m128i a0_14;
  __m128i v1_14;
  __m128i v0_14;
  __m128i u1_14;
  __m128i u0_14;
  __m128i t1_14;
  __m128i t0_14;
  __m128i d1_13;
  __m128i d0_13;
  __m128i c1_13;
  __m128i c0_13;
  __m128i b1_13;
  __m128i b0_13;
  __m128i a1_13;
  __m128i a0_13;
  __m128i v1_13;
  __m128i v0_13;
  __m128i u1_13;
  __m128i u0_13;
  __m128i t1_13;
  __m128i t0_13;
  __m128i d1_12;
  __m128i d0_12;
  __m128i c1_12;
  __m128i c0_12;
  __m128i b1_12;
  __m128i b0_12;
  __m128i a1_12;
  __m128i a0_12;
  __m128i v1_12;
  __m128i v0_12;
  __m128i u1_12;
  __m128i u0_12;
  __m128i t1_12;
  __m128i t0_12;
  __m128i x8 [16];
  __m128i x7 [16];
  __m128i d1_11;
  __m128i d0_11;
  __m128i c1_11;
  __m128i c0_11;
  __m128i b1_11;
  __m128i b0_11;
  __m128i a1_11;
  __m128i a0_11;
  __m128i v1_11;
  __m128i v0_11;
  __m128i u1_11;
  __m128i u0_11;
  __m128i t1_11;
  __m128i t0_11;
  __m128i d1_10;
  __m128i d0_10;
  __m128i c1_10;
  __m128i c0_10;
  __m128i b1_10;
  __m128i b0_10;
  __m128i a1_10;
  __m128i a0_10;
  __m128i v1_10;
  __m128i v0_10;
  __m128i u1_10;
  __m128i u0_10;
  __m128i t1_10;
  __m128i t0_10;
  __m128i d1_9;
  __m128i d0_9;
  __m128i c1_9;
  __m128i c0_9;
  __m128i b1_9;
  __m128i b0_9;
  __m128i a1_9;
  __m128i a0_9;
  __m128i v1_9;
  __m128i v0_9;
  __m128i u1_9;
  __m128i u0_9;
  __m128i t1_9;
  __m128i t0_9;
  __m128i d1_8;
  __m128i d0_8;
  __m128i c1_8;
  __m128i c0_8;
  __m128i b1_8;
  __m128i b0_8;
  __m128i a1_8;
  __m128i a0_8;
  __m128i v1_8;
  __m128i v0_8;
  __m128i u1_8;
  __m128i u0_8;
  __m128i t1_8;
  __m128i t0_8;
  __m128i x6 [16];
  __m128i x5 [16];
  __m128i d1_7;
  __m128i d0_7;
  __m128i c1_7;
  __m128i c0_7;
  __m128i b1_7;
  __m128i b0_7;
  __m128i a1_7;
  __m128i a0_7;
  __m128i v1_7;
  __m128i v0_7;
  __m128i u1_7;
  __m128i u0_7;
  __m128i t1_7;
  __m128i t0_7;
  __m128i d1_6;
  __m128i d0_6;
  __m128i c1_6;
  __m128i c0_6;
  __m128i b1_6;
  __m128i b0_6;
  __m128i a1_6;
  __m128i a0_6;
  __m128i v1_6;
  __m128i v0_6;
  __m128i u1_6;
  __m128i u0_6;
  __m128i t1_6;
  __m128i t0_6;
  __m128i d1_5;
  __m128i d0_5;
  __m128i c1_5;
  __m128i c0_5;
  __m128i b1_5;
  __m128i b0_5;
  __m128i a1_5;
  __m128i a0_5;
  __m128i v1_5;
  __m128i v0_5;
  __m128i u1_5;
  __m128i u0_5;
  __m128i t1_5;
  __m128i t0_5;
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i x4 [16];
  __m128i x3 [16];
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i x2 [16];
  __m128i x1 [16];
  __m128i cospi_p06_m58;
  __m128i cospi_p58_p06;
  __m128i cospi_p14_m50;
  __m128i cospi_p50_p14;
  __m128i cospi_p22_m42;
  __m128i cospi_p42_p22;
  __m128i cospi_p30_m34;
  __m128i cospi_p34_p30;
  __m128i cospi_p38_m26;
  __m128i cospi_p26_p38;
  __m128i cospi_p46_m18;
  __m128i cospi_p18_p46;
  __m128i cospi_p54_m10;
  __m128i cospi_p10_p54;
  __m128i cospi_p62_m02;
  __m128i cospi_p02_p62;
  __m128i cospi_m24_p40;
  __m128i cospi_m56_p08;
  __m128i cospi_p24_m40;
  __m128i cospi_p40_p24;
  __m128i cospi_p56_m08;
  __m128i cospi_p08_p56;
  __m128i cospi_m48_p16;
  __m128i cospi_p48_m16;
  __m128i cospi_p16_p48;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i __rounding;
  __m128i __zero;
  int32_t *cospi;
  undefined8 local_4778;
  undefined8 uStack_4770;
  undefined8 local_4768;
  undefined8 uStack_4760;
  undefined8 local_4758;
  undefined8 uStack_4750;
  undefined8 local_4748;
  undefined8 uStack_4740;
  undefined8 local_4738;
  undefined8 uStack_4730;
  undefined8 local_4728;
  undefined8 uStack_4720;
  undefined8 local_4718;
  undefined8 uStack_4710;
  undefined8 local_4708;
  undefined8 uStack_4700;
  undefined8 local_46f8;
  undefined8 uStack_46f0;
  undefined8 local_46e8;
  undefined8 uStack_46e0;
  undefined8 local_46d8;
  undefined8 uStack_46d0;
  undefined8 local_46c8;
  undefined8 uStack_46c0;
  undefined8 local_46b8;
  undefined8 uStack_46b0;
  undefined8 local_46a8;
  undefined8 uStack_46a0;
  undefined8 local_4698;
  undefined8 uStack_4690;
  undefined8 local_4688;
  undefined8 uStack_4680;
  undefined2 local_2b98;
  undefined2 uStack_2b96;
  undefined2 uStack_2b94;
  undefined2 uStack_2b92;
  undefined2 local_2b88;
  undefined2 uStack_2b86;
  undefined2 uStack_2b84;
  undefined2 uStack_2b82;
  undefined2 local_2b78;
  undefined2 uStack_2b76;
  undefined2 uStack_2b74;
  undefined2 uStack_2b72;
  undefined2 local_2b68;
  undefined2 uStack_2b66;
  undefined2 uStack_2b64;
  undefined2 uStack_2b62;
  undefined2 local_2b58;
  undefined2 uStack_2b56;
  undefined2 uStack_2b54;
  undefined2 uStack_2b52;
  undefined2 local_2b48;
  undefined2 uStack_2b46;
  undefined2 uStack_2b44;
  undefined2 uStack_2b42;
  undefined2 local_2b38;
  undefined2 uStack_2b36;
  undefined2 uStack_2b34;
  undefined2 uStack_2b32;
  undefined2 local_2b28;
  undefined2 uStack_2b26;
  undefined2 uStack_2b24;
  undefined2 uStack_2b22;
  undefined2 local_2b18;
  undefined2 uStack_2b16;
  undefined2 uStack_2b14;
  undefined2 uStack_2b12;
  undefined2 local_2b08;
  undefined2 uStack_2b06;
  undefined2 uStack_2b04;
  undefined2 uStack_2b02;
  undefined2 local_2af8;
  undefined2 uStack_2af6;
  undefined2 uStack_2af4;
  undefined2 uStack_2af2;
  undefined2 local_2ae8;
  undefined2 uStack_2ae6;
  undefined2 uStack_2ae4;
  undefined2 uStack_2ae2;
  undefined2 local_2ad8;
  undefined2 uStack_2ad6;
  undefined2 uStack_2ad4;
  undefined2 uStack_2ad2;
  undefined2 local_2ac8;
  undefined2 uStack_2ac6;
  undefined2 uStack_2ac4;
  undefined2 uStack_2ac2;
  undefined2 local_2ab8;
  undefined2 uStack_2ab6;
  undefined2 uStack_2ab4;
  undefined2 uStack_2ab2;
  undefined2 local_2aa8;
  undefined2 uStack_2aa6;
  undefined2 uStack_2aa4;
  undefined2 uStack_2aa2;
  undefined2 local_2a98;
  undefined2 uStack_2a96;
  undefined2 uStack_2a94;
  undefined2 uStack_2a92;
  undefined2 local_2a88;
  undefined2 uStack_2a86;
  undefined2 uStack_2a84;
  undefined2 uStack_2a82;
  undefined2 local_2a78;
  undefined2 uStack_2a76;
  undefined2 uStack_2a74;
  undefined2 uStack_2a72;
  undefined2 local_2a68;
  undefined2 uStack_2a66;
  undefined2 uStack_2a64;
  undefined2 uStack_2a62;
  undefined2 local_2a58;
  undefined2 uStack_2a56;
  undefined2 uStack_2a54;
  undefined2 uStack_2a52;
  undefined2 local_2a48;
  undefined2 uStack_2a46;
  undefined2 uStack_2a44;
  undefined2 uStack_2a42;
  undefined2 local_2a38;
  undefined2 uStack_2a36;
  undefined2 uStack_2a34;
  undefined2 uStack_2a32;
  undefined2 local_2a28;
  undefined2 uStack_2a26;
  undefined2 uStack_2a24;
  undefined2 uStack_2a22;
  undefined2 local_2a18;
  undefined2 uStack_2a16;
  undefined2 uStack_2a14;
  undefined2 uStack_2a12;
  undefined2 local_2a08;
  undefined2 uStack_2a06;
  undefined2 uStack_2a04;
  undefined2 uStack_2a02;
  undefined2 local_29f8;
  undefined2 uStack_29f6;
  undefined2 uStack_29f4;
  undefined2 uStack_29f2;
  undefined2 local_29e8;
  undefined2 uStack_29e6;
  undefined2 uStack_29e4;
  undefined2 uStack_29e2;
  undefined2 local_29d8;
  undefined2 uStack_29d6;
  undefined2 uStack_29d4;
  undefined2 uStack_29d2;
  undefined2 local_29c8;
  undefined2 uStack_29c6;
  undefined2 uStack_29c4;
  undefined2 uStack_29c2;
  undefined2 local_29b8;
  undefined2 uStack_29b6;
  undefined2 uStack_29b4;
  undefined2 uStack_29b2;
  undefined2 local_29a8;
  undefined2 uStack_29a6;
  undefined2 uStack_29a4;
  undefined2 uStack_29a2;
  undefined2 local_2998;
  undefined2 uStack_2996;
  undefined2 uStack_2994;
  undefined2 uStack_2992;
  undefined2 local_2988;
  undefined2 uStack_2986;
  undefined2 uStack_2984;
  undefined2 uStack_2982;
  undefined2 local_2978;
  undefined2 uStack_2976;
  undefined2 uStack_2974;
  undefined2 uStack_2972;
  undefined2 local_2968;
  undefined2 uStack_2966;
  undefined2 uStack_2964;
  undefined2 uStack_2962;
  undefined2 local_2958;
  undefined2 uStack_2956;
  undefined2 uStack_2954;
  undefined2 uStack_2952;
  undefined2 local_2948;
  undefined2 uStack_2946;
  undefined2 uStack_2944;
  undefined2 uStack_2942;
  undefined2 local_2938;
  undefined2 uStack_2936;
  undefined2 uStack_2934;
  undefined2 uStack_2932;
  undefined2 local_2928;
  undefined2 uStack_2926;
  undefined2 uStack_2924;
  undefined2 uStack_2922;
  undefined2 uStack_2910;
  undefined2 uStack_290e;
  undefined2 uStack_290c;
  undefined2 uStack_290a;
  undefined2 uStack_2900;
  undefined2 uStack_28fe;
  undefined2 uStack_28fc;
  undefined2 uStack_28fa;
  undefined2 uStack_28f0;
  undefined2 uStack_28ee;
  undefined2 uStack_28ec;
  undefined2 uStack_28ea;
  undefined2 uStack_28e0;
  undefined2 uStack_28de;
  undefined2 uStack_28dc;
  undefined2 uStack_28da;
  undefined2 uStack_28d0;
  undefined2 uStack_28ce;
  undefined2 uStack_28cc;
  undefined2 uStack_28ca;
  undefined2 uStack_28c0;
  undefined2 uStack_28be;
  undefined2 uStack_28bc;
  undefined2 uStack_28ba;
  undefined2 uStack_28b0;
  undefined2 uStack_28ae;
  undefined2 uStack_28ac;
  undefined2 uStack_28aa;
  undefined2 uStack_28a0;
  undefined2 uStack_289e;
  undefined2 uStack_289c;
  undefined2 uStack_289a;
  undefined2 uStack_2890;
  undefined2 uStack_288e;
  undefined2 uStack_288c;
  undefined2 uStack_288a;
  undefined2 uStack_2880;
  undefined2 uStack_287e;
  undefined2 uStack_287c;
  undefined2 uStack_287a;
  undefined2 uStack_2870;
  undefined2 uStack_286e;
  undefined2 uStack_286c;
  undefined2 uStack_286a;
  undefined2 uStack_2860;
  undefined2 uStack_285e;
  undefined2 uStack_285c;
  undefined2 uStack_285a;
  undefined2 uStack_2850;
  undefined2 uStack_284e;
  undefined2 uStack_284c;
  undefined2 uStack_284a;
  undefined2 uStack_2840;
  undefined2 uStack_283e;
  undefined2 uStack_283c;
  undefined2 uStack_283a;
  undefined2 uStack_2830;
  undefined2 uStack_282e;
  undefined2 uStack_282c;
  undefined2 uStack_282a;
  undefined2 uStack_2820;
  undefined2 uStack_281e;
  undefined2 uStack_281c;
  undefined2 uStack_281a;
  undefined2 uStack_2810;
  undefined2 uStack_280e;
  undefined2 uStack_280c;
  undefined2 uStack_280a;
  undefined2 uStack_2800;
  undefined2 uStack_27fe;
  undefined2 uStack_27fc;
  undefined2 uStack_27fa;
  undefined2 uStack_27f0;
  undefined2 uStack_27ee;
  undefined2 uStack_27ec;
  undefined2 uStack_27ea;
  undefined2 uStack_27e0;
  undefined2 uStack_27de;
  undefined2 uStack_27dc;
  undefined2 uStack_27da;
  undefined2 uStack_27d0;
  undefined2 uStack_27ce;
  undefined2 uStack_27cc;
  undefined2 uStack_27ca;
  undefined2 uStack_27c0;
  undefined2 uStack_27be;
  undefined2 uStack_27bc;
  undefined2 uStack_27ba;
  undefined2 uStack_27b0;
  undefined2 uStack_27ae;
  undefined2 uStack_27ac;
  undefined2 uStack_27aa;
  undefined2 uStack_27a0;
  undefined2 uStack_279e;
  undefined2 uStack_279c;
  undefined2 uStack_279a;
  undefined2 uStack_2790;
  undefined2 uStack_278e;
  undefined2 uStack_278c;
  undefined2 uStack_278a;
  undefined2 uStack_2780;
  undefined2 uStack_277e;
  undefined2 uStack_277c;
  undefined2 uStack_277a;
  undefined2 uStack_2770;
  undefined2 uStack_276e;
  undefined2 uStack_276c;
  undefined2 uStack_276a;
  undefined2 uStack_2760;
  undefined2 uStack_275e;
  undefined2 uStack_275c;
  undefined2 uStack_275a;
  undefined2 uStack_2750;
  undefined2 uStack_274e;
  undefined2 uStack_274c;
  undefined2 uStack_274a;
  undefined2 uStack_2740;
  undefined2 uStack_273e;
  undefined2 uStack_273c;
  undefined2 uStack_273a;
  undefined2 uStack_2730;
  undefined2 uStack_272e;
  undefined2 uStack_272c;
  undefined2 uStack_272a;
  undefined2 uStack_2720;
  undefined2 uStack_271e;
  undefined2 uStack_271c;
  undefined2 uStack_271a;
  undefined2 uStack_2710;
  undefined2 uStack_270e;
  undefined2 uStack_270c;
  undefined2 uStack_270a;
  undefined2 uStack_2700;
  undefined2 uStack_26fe;
  undefined2 uStack_26fc;
  undefined2 uStack_26fa;
  undefined2 uStack_26f0;
  undefined2 uStack_26ee;
  undefined2 uStack_26ec;
  undefined2 uStack_26ea;
  undefined2 uStack_26e0;
  undefined2 uStack_26de;
  undefined2 uStack_26dc;
  undefined2 uStack_26da;
  undefined2 uStack_26d0;
  undefined2 uStack_26ce;
  undefined2 uStack_26cc;
  undefined2 uStack_26ca;
  undefined2 uStack_26c0;
  undefined2 uStack_26be;
  undefined2 uStack_26bc;
  undefined2 uStack_26ba;
  undefined2 uStack_26b0;
  undefined2 uStack_26ae;
  undefined2 uStack_26ac;
  undefined2 uStack_26aa;
  undefined2 uStack_26a0;
  undefined2 uStack_269e;
  undefined2 uStack_269c;
  undefined2 uStack_269a;
  int local_1c88;
  int iStack_1c84;
  int iStack_1c80;
  int iStack_1c7c;
  int local_1c68;
  int iStack_1c64;
  int iStack_1c60;
  int iStack_1c5c;
  int local_1c48;
  int iStack_1c44;
  int iStack_1c40;
  int iStack_1c3c;
  int local_1c28;
  int iStack_1c24;
  int iStack_1c20;
  int iStack_1c1c;
  int local_1c08;
  int iStack_1c04;
  int iStack_1c00;
  int iStack_1bfc;
  int local_1be8;
  int iStack_1be4;
  int iStack_1be0;
  int iStack_1bdc;
  int local_1bc8;
  int iStack_1bc4;
  int iStack_1bc0;
  int iStack_1bbc;
  int local_1ba8;
  int iStack_1ba4;
  int iStack_1ba0;
  int iStack_1b9c;
  int local_1b88;
  int iStack_1b84;
  int iStack_1b80;
  int iStack_1b7c;
  int local_1b68;
  int iStack_1b64;
  int iStack_1b60;
  int iStack_1b5c;
  int local_1b48;
  int iStack_1b44;
  int iStack_1b40;
  int iStack_1b3c;
  int local_1b28;
  int iStack_1b24;
  int iStack_1b20;
  int iStack_1b1c;
  int local_1b08;
  int iStack_1b04;
  int iStack_1b00;
  int iStack_1afc;
  int local_1ae8;
  int iStack_1ae4;
  int iStack_1ae0;
  int iStack_1adc;
  int local_1ac8;
  int iStack_1ac4;
  int iStack_1ac0;
  int iStack_1abc;
  int local_1aa8;
  int iStack_1aa4;
  int iStack_1aa0;
  int iStack_1a9c;
  int local_1a88;
  int iStack_1a84;
  int iStack_1a80;
  int iStack_1a7c;
  int local_1a68;
  int iStack_1a64;
  int iStack_1a60;
  int iStack_1a5c;
  int local_1a48;
  int iStack_1a44;
  int iStack_1a40;
  int iStack_1a3c;
  int local_1a28;
  int iStack_1a24;
  int iStack_1a20;
  int iStack_1a1c;
  int local_1a08;
  int iStack_1a04;
  int iStack_1a00;
  int iStack_19fc;
  int local_19e8;
  int iStack_19e4;
  int iStack_19e0;
  int iStack_19dc;
  int local_19c8;
  int iStack_19c4;
  int iStack_19c0;
  int iStack_19bc;
  int local_19a8;
  int iStack_19a4;
  int iStack_19a0;
  int iStack_199c;
  int local_1988;
  int iStack_1984;
  int iStack_1980;
  int iStack_197c;
  int local_1968;
  int iStack_1964;
  int iStack_1960;
  int iStack_195c;
  int local_1948;
  int iStack_1944;
  int iStack_1940;
  int iStack_193c;
  int local_1928;
  int iStack_1924;
  int iStack_1920;
  int iStack_191c;
  int local_1908;
  int iStack_1904;
  int iStack_1900;
  int iStack_18fc;
  int local_18e8;
  int iStack_18e4;
  int iStack_18e0;
  int iStack_18dc;
  int local_18c8;
  int iStack_18c4;
  int iStack_18c0;
  int iStack_18bc;
  int local_18a8;
  int iStack_18a4;
  int iStack_18a0;
  int iStack_189c;
  int local_1888;
  int iStack_1884;
  int iStack_1880;
  int iStack_187c;
  int local_1868;
  int iStack_1864;
  int iStack_1860;
  int iStack_185c;
  int local_1848;
  int iStack_1844;
  int iStack_1840;
  int iStack_183c;
  int local_1828;
  int iStack_1824;
  int iStack_1820;
  int iStack_181c;
  int local_1808;
  int iStack_1804;
  int iStack_1800;
  int iStack_17fc;
  int local_17e8;
  int iStack_17e4;
  int iStack_17e0;
  int iStack_17dc;
  int local_17c8;
  int iStack_17c4;
  int iStack_17c0;
  int iStack_17bc;
  int local_17a8;
  int iStack_17a4;
  int iStack_17a0;
  int iStack_179c;
  int local_1788;
  int iStack_1784;
  int iStack_1780;
  int iStack_177c;
  int local_1768;
  int iStack_1764;
  int iStack_1760;
  int iStack_175c;
  int local_1748;
  int iStack_1744;
  int iStack_1740;
  int iStack_173c;
  int local_1728;
  int iStack_1724;
  int iStack_1720;
  int iStack_171c;
  int local_1708;
  int iStack_1704;
  int iStack_1700;
  int iStack_16fc;
  int local_16e8;
  int iStack_16e4;
  int iStack_16e0;
  int iStack_16dc;
  int local_16c8;
  int iStack_16c4;
  int iStack_16c0;
  int iStack_16bc;
  int local_16a8;
  int iStack_16a4;
  int iStack_16a0;
  int iStack_169c;
  int local_1688;
  int iStack_1684;
  int iStack_1680;
  int iStack_167c;
  int local_1668;
  int iStack_1664;
  int iStack_1660;
  int iStack_165c;
  int local_1648;
  int iStack_1644;
  int iStack_1640;
  int iStack_163c;
  int local_1628;
  int iStack_1624;
  int iStack_1620;
  int iStack_161c;
  int local_1608;
  int iStack_1604;
  int iStack_1600;
  int iStack_15fc;
  int local_15e8;
  int iStack_15e4;
  int iStack_15e0;
  int iStack_15dc;
  int local_15c8;
  int iStack_15c4;
  int iStack_15c0;
  int iStack_15bc;
  int local_15a8;
  int iStack_15a4;
  int iStack_15a0;
  int iStack_159c;
  int local_1588;
  int iStack_1584;
  int iStack_1580;
  int iStack_157c;
  int local_1568;
  int iStack_1564;
  int iStack_1560;
  int iStack_155c;
  int local_1548;
  int iStack_1544;
  int iStack_1540;
  int iStack_153c;
  int local_1528;
  int iStack_1524;
  int iStack_1520;
  int iStack_151c;
  int local_1508;
  int iStack_1504;
  int iStack_1500;
  int iStack_14fc;
  int local_14e8;
  int iStack_14e4;
  int iStack_14e0;
  int iStack_14dc;
  int local_14c8;
  int iStack_14c4;
  int iStack_14c0;
  int iStack_14bc;
  int local_14a8;
  int iStack_14a4;
  int iStack_14a0;
  int iStack_149c;
  int local_1488;
  int iStack_1484;
  int iStack_1480;
  int iStack_147c;
  int local_1468;
  int iStack_1464;
  int iStack_1460;
  int iStack_145c;
  int local_1448;
  int iStack_1444;
  int iStack_1440;
  int iStack_143c;
  int local_1428;
  int iStack_1424;
  int iStack_1420;
  int iStack_141c;
  int local_1408;
  int iStack_1404;
  int iStack_1400;
  int iStack_13fc;
  int local_13e8;
  int iStack_13e4;
  int iStack_13e0;
  int iStack_13dc;
  int local_13c8;
  int iStack_13c4;
  int iStack_13c0;
  int iStack_13bc;
  int local_13a8;
  int iStack_13a4;
  int iStack_13a0;
  int iStack_139c;
  int local_1388;
  int iStack_1384;
  int iStack_1380;
  int iStack_137c;
  int local_1368;
  int iStack_1364;
  int iStack_1360;
  int iStack_135c;
  int local_1348;
  int iStack_1344;
  int iStack_1340;
  int iStack_133c;
  int local_1328;
  int iStack_1324;
  int iStack_1320;
  int iStack_131c;
  int local_1308;
  int iStack_1304;
  int iStack_1300;
  int iStack_12fc;
  int local_12e8;
  int iStack_12e4;
  int iStack_12e0;
  int iStack_12dc;
  int local_12c8;
  int iStack_12c4;
  int iStack_12c0;
  int iStack_12bc;
  int local_12a8;
  int iStack_12a4;
  int iStack_12a0;
  int iStack_129c;
  
  piVar257 = cospi_arr((int)in_DL);
  iVar235 = 1 << (in_DL - 1U & 0x1f);
  uVar236 = CONCAT22((short)piVar257[0x20],(short)piVar257[0x20]);
  uVar221 = CONCAT44(uVar236,uVar236);
  uVar222 = CONCAT44(uVar236,uVar236);
  iVar237 = (piVar257[0x20] & 0xffffU) + piVar257[0x20] * -0x10000;
  uVar223 = CONCAT44(iVar237,iVar237);
  uVar224 = CONCAT44(iVar237,iVar237);
  uVar238 = (uint)*(ushort *)(piVar257 + 0x10) | piVar257[0x30] << 0x10;
  uVar225 = CONCAT44(uVar238,uVar238);
  uVar226 = CONCAT44(uVar238,uVar238);
  iVar237 = (uint)*(ushort *)(piVar257 + 0x30) + piVar257[0x10] * -0x10000;
  uVar227 = CONCAT44(iVar237,iVar237);
  uVar228 = CONCAT44(iVar237,iVar237);
  uVar238 = -piVar257[0x30] & 0xffffU | piVar257[0x10] << 0x10;
  uVar229 = CONCAT44(uVar238,uVar238);
  uVar230 = CONCAT44(uVar238,uVar238);
  uVar238 = (uint)*(ushort *)(piVar257 + 8) | piVar257[0x38] << 0x10;
  uVar231 = CONCAT44(uVar238,uVar238);
  uVar232 = CONCAT44(uVar238,uVar238);
  iVar237 = (uint)*(ushort *)(piVar257 + 0x38) + piVar257[8] * -0x10000;
  uVar238 = (uint)*(ushort *)(piVar257 + 0x28) | piVar257[0x18] << 0x10;
  uVar233 = CONCAT44(uVar238,uVar238);
  uVar234 = CONCAT44(uVar238,uVar238);
  iVar239 = (uint)*(ushort *)(piVar257 + 0x18) + piVar257[0x28] * -0x10000;
  uVar238 = -piVar257[0x38] & 0xffffU | piVar257[8] << 0x10;
  uVar240 = -piVar257[0x18] & 0xffffU | piVar257[0x28] << 0x10;
  uVar241 = (uint)*(ushort *)(piVar257 + 2) | piVar257[0x3e] << 0x10;
  iVar242 = (uint)*(ushort *)(piVar257 + 0x3e) + piVar257[2] * -0x10000;
  uVar243 = (uint)*(ushort *)(piVar257 + 10) | piVar257[0x36] << 0x10;
  iVar244 = (uint)*(ushort *)(piVar257 + 0x36) + piVar257[10] * -0x10000;
  uVar245 = (uint)*(ushort *)(piVar257 + 0x12) | piVar257[0x2e] << 0x10;
  iVar246 = (uint)*(ushort *)(piVar257 + 0x2e) + piVar257[0x12] * -0x10000;
  uVar247 = (uint)*(ushort *)(piVar257 + 0x1a) | piVar257[0x26] << 0x10;
  iVar248 = (uint)*(ushort *)(piVar257 + 0x26) + piVar257[0x1a] * -0x10000;
  uVar249 = (uint)*(ushort *)(piVar257 + 0x22) | piVar257[0x1e] << 0x10;
  iVar250 = (uint)*(ushort *)(piVar257 + 0x1e) + piVar257[0x22] * -0x10000;
  uVar251 = (uint)*(ushort *)(piVar257 + 0x2a) | piVar257[0x16] << 0x10;
  iVar252 = (uint)*(ushort *)(piVar257 + 0x16) + piVar257[0x2a] * -0x10000;
  uVar253 = (uint)*(ushort *)(piVar257 + 0x32) | piVar257[0xe] << 0x10;
  iVar254 = (uint)*(ushort *)(piVar257 + 0xe) + piVar257[0x32] * -0x10000;
  uVar255 = (uint)*(ushort *)(piVar257 + 0x3a) | piVar257[6] << 0x10;
  iVar256 = (uint)*(ushort *)(piVar257 + 6) + piVar257[0x3a] * -0x10000;
  auVar258 = psubsw(ZEXT816(0),in_RDI[0xf]);
  auVar259 = psubsw(ZEXT816(0),in_RDI[7]);
  uVar1 = *(undefined8 *)in_RDI[8];
  uVar2 = *(undefined8 *)(in_RDI[8] + 8);
  auVar260 = psubsw(ZEXT816(0),in_RDI[3]);
  uVar3 = *(undefined8 *)in_RDI[4];
  uVar4 = *(undefined8 *)(in_RDI[4] + 8);
  auVar261 = psubsw(ZEXT816(0),in_RDI[0xb]);
  auVar262 = psubsw(ZEXT816(0),in_RDI[1]);
  uVar5 = *(undefined8 *)in_RDI[6];
  uVar6 = *(undefined8 *)(in_RDI[6] + 8);
  auVar263 = psubsw(ZEXT816(0),in_RDI[9]);
  auVar264 = psubsw(ZEXT816(0),in_RDI[0xd]);
  auVar265 = psubsw(ZEXT816(0),in_RDI[5]);
  uVar7 = *(undefined8 *)in_RDI[10];
  uVar8 = *(undefined8 *)(in_RDI[10] + 8);
  local_2928 = auVar259._0_2_;
  uStack_2926 = auVar259._2_2_;
  uStack_2924 = auVar259._4_2_;
  uStack_2922 = auVar259._6_2_;
  local_2938 = (undefined2)uVar1;
  uStack_2936 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_2934 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_2932 = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_26a0 = auVar259._8_2_;
  uStack_269e = auVar259._10_2_;
  uStack_269c = auVar259._12_2_;
  uStack_269a = auVar259._14_2_;
  uStack_26b0 = (undefined2)uVar2;
  uStack_26ae = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_26ac = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_26aa = (undefined2)((ulong)uVar2 >> 0x30);
  auVar140._2_2_ = local_2938;
  auVar140._0_2_ = local_2928;
  auVar140._4_2_ = uStack_2926;
  auVar140._6_2_ = uStack_2936;
  auVar140._10_2_ = uStack_2934;
  auVar140._8_2_ = uStack_2924;
  auVar140._12_2_ = uStack_2922;
  auVar140._14_2_ = uStack_2932;
  auVar139._8_8_ = uVar222;
  auVar139._0_8_ = uVar221;
  auVar259 = pmaddwd(auVar140,auVar139);
  auVar138._2_2_ = uStack_26b0;
  auVar138._0_2_ = uStack_26a0;
  auVar138._4_2_ = uStack_269e;
  auVar138._6_2_ = uStack_26ae;
  auVar138._10_2_ = uStack_26ac;
  auVar138._8_2_ = uStack_269c;
  auVar138._12_2_ = uStack_269a;
  auVar138._14_2_ = uStack_26aa;
  auVar137._8_8_ = uVar222;
  auVar137._0_8_ = uVar221;
  auVar266 = pmaddwd(auVar138,auVar137);
  auVar136._2_2_ = local_2938;
  auVar136._0_2_ = local_2928;
  auVar136._4_2_ = uStack_2926;
  auVar136._6_2_ = uStack_2936;
  auVar136._10_2_ = uStack_2934;
  auVar136._8_2_ = uStack_2924;
  auVar136._12_2_ = uStack_2922;
  auVar136._14_2_ = uStack_2932;
  auVar135._8_8_ = uVar224;
  auVar135._0_8_ = uVar223;
  auVar267 = pmaddwd(auVar136,auVar135);
  auVar134._2_2_ = uStack_26b0;
  auVar134._0_2_ = uStack_26a0;
  auVar134._4_2_ = uStack_269e;
  auVar134._6_2_ = uStack_26ae;
  auVar134._10_2_ = uStack_26ac;
  auVar134._8_2_ = uStack_269c;
  auVar134._12_2_ = uStack_269a;
  auVar134._14_2_ = uStack_26aa;
  auVar133._8_8_ = uVar224;
  auVar133._0_8_ = uVar223;
  auVar268 = pmaddwd(auVar134,auVar133);
  local_12a8 = auVar259._0_4_;
  iStack_12a4 = auVar259._4_4_;
  iStack_12a0 = auVar259._8_4_;
  iStack_129c = auVar259._12_4_;
  local_12c8 = auVar266._0_4_;
  iStack_12c4 = auVar266._4_4_;
  iStack_12c0 = auVar266._8_4_;
  iStack_12bc = auVar266._12_4_;
  local_12e8 = auVar267._0_4_;
  iStack_12e4 = auVar267._4_4_;
  iStack_12e0 = auVar267._8_4_;
  iStack_12dc = auVar267._12_4_;
  local_1308 = auVar268._0_4_;
  iStack_1304 = auVar268._4_4_;
  iStack_1300 = auVar268._8_4_;
  iStack_12fc = auVar268._12_4_;
  auVar259 = ZEXT416((uint)(int)in_DL);
  auVar266 = ZEXT416((uint)(int)in_DL);
  auVar267 = ZEXT416((uint)(int)in_DL);
  auVar268 = ZEXT416((uint)(int)in_DL);
  auVar220._4_4_ = iStack_12a4 + iVar235 >> auVar259;
  auVar220._0_4_ = local_12a8 + iVar235 >> auVar259;
  auVar220._12_4_ = iStack_129c + iVar235 >> auVar259;
  auVar220._8_4_ = iStack_12a0 + iVar235 >> auVar259;
  auVar219._4_4_ = iStack_12c4 + iVar235 >> auVar266;
  auVar219._0_4_ = local_12c8 + iVar235 >> auVar266;
  auVar219._12_4_ = iStack_12bc + iVar235 >> auVar266;
  auVar219._8_4_ = iStack_12c0 + iVar235 >> auVar266;
  auVar259 = packssdw(auVar220,auVar219);
  auVar218._4_4_ = iStack_12e4 + iVar235 >> auVar267;
  auVar218._0_4_ = local_12e8 + iVar235 >> auVar267;
  auVar218._12_4_ = iStack_12dc + iVar235 >> auVar267;
  auVar218._8_4_ = iStack_12e0 + iVar235 >> auVar267;
  auVar217._4_4_ = iStack_1304 + iVar235 >> auVar268;
  auVar217._0_4_ = local_1308 + iVar235 >> auVar268;
  auVar217._12_4_ = iStack_12fc + iVar235 >> auVar268;
  auVar217._8_4_ = iStack_1300 + iVar235 >> auVar268;
  auVar266 = packssdw(auVar218,auVar217);
  local_2948 = (undefined2)uVar3;
  uStack_2946 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_2944 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_2942 = (undefined2)((ulong)uVar3 >> 0x30);
  local_2958 = auVar261._0_2_;
  uStack_2956 = auVar261._2_2_;
  uStack_2954 = auVar261._4_2_;
  uStack_2952 = auVar261._6_2_;
  uStack_26c0 = (undefined2)uVar4;
  uStack_26be = (undefined2)((ulong)uVar4 >> 0x10);
  uStack_26bc = (undefined2)((ulong)uVar4 >> 0x20);
  uStack_26ba = (undefined2)((ulong)uVar4 >> 0x30);
  uStack_26d0 = auVar261._8_2_;
  uStack_26ce = auVar261._10_2_;
  uStack_26cc = auVar261._12_2_;
  uStack_26ca = auVar261._14_2_;
  auVar132._2_2_ = local_2958;
  auVar132._0_2_ = local_2948;
  auVar132._4_2_ = uStack_2946;
  auVar132._6_2_ = uStack_2956;
  auVar132._10_2_ = uStack_2954;
  auVar132._8_2_ = uStack_2944;
  auVar132._12_2_ = uStack_2942;
  auVar132._14_2_ = uStack_2952;
  auVar131._8_8_ = uVar222;
  auVar131._0_8_ = uVar221;
  auVar261 = pmaddwd(auVar132,auVar131);
  auVar130._2_2_ = uStack_26d0;
  auVar130._0_2_ = uStack_26c0;
  auVar130._4_2_ = uStack_26be;
  auVar130._6_2_ = uStack_26ce;
  auVar130._10_2_ = uStack_26cc;
  auVar130._8_2_ = uStack_26bc;
  auVar130._12_2_ = uStack_26ba;
  auVar130._14_2_ = uStack_26ca;
  auVar129._8_8_ = uVar222;
  auVar129._0_8_ = uVar221;
  auVar267 = pmaddwd(auVar130,auVar129);
  auVar128._2_2_ = local_2958;
  auVar128._0_2_ = local_2948;
  auVar128._4_2_ = uStack_2946;
  auVar128._6_2_ = uStack_2956;
  auVar128._10_2_ = uStack_2954;
  auVar128._8_2_ = uStack_2944;
  auVar128._12_2_ = uStack_2942;
  auVar128._14_2_ = uStack_2952;
  auVar127._8_8_ = uVar224;
  auVar127._0_8_ = uVar223;
  auVar268 = pmaddwd(auVar128,auVar127);
  auVar126._2_2_ = uStack_26d0;
  auVar126._0_2_ = uStack_26c0;
  auVar126._4_2_ = uStack_26be;
  auVar126._6_2_ = uStack_26ce;
  auVar126._10_2_ = uStack_26cc;
  auVar126._8_2_ = uStack_26bc;
  auVar126._12_2_ = uStack_26ba;
  auVar126._14_2_ = uStack_26ca;
  auVar125._8_8_ = uVar224;
  auVar125._0_8_ = uVar223;
  auVar269 = pmaddwd(auVar126,auVar125);
  local_1328 = auVar261._0_4_;
  iStack_1324 = auVar261._4_4_;
  iStack_1320 = auVar261._8_4_;
  iStack_131c = auVar261._12_4_;
  local_1348 = auVar267._0_4_;
  iStack_1344 = auVar267._4_4_;
  iStack_1340 = auVar267._8_4_;
  iStack_133c = auVar267._12_4_;
  local_1368 = auVar268._0_4_;
  iStack_1364 = auVar268._4_4_;
  iStack_1360 = auVar268._8_4_;
  iStack_135c = auVar268._12_4_;
  local_1388 = auVar269._0_4_;
  iStack_1384 = auVar269._4_4_;
  iStack_1380 = auVar269._8_4_;
  iStack_137c = auVar269._12_4_;
  auVar261 = ZEXT416((uint)(int)in_DL);
  auVar267 = ZEXT416((uint)(int)in_DL);
  auVar268 = ZEXT416((uint)(int)in_DL);
  auVar269 = ZEXT416((uint)(int)in_DL);
  auVar216._4_4_ = iStack_1324 + iVar235 >> auVar261;
  auVar216._0_4_ = local_1328 + iVar235 >> auVar261;
  auVar216._12_4_ = iStack_131c + iVar235 >> auVar261;
  auVar216._8_4_ = iStack_1320 + iVar235 >> auVar261;
  auVar215._4_4_ = iStack_1344 + iVar235 >> auVar267;
  auVar215._0_4_ = local_1348 + iVar235 >> auVar267;
  auVar215._12_4_ = iStack_133c + iVar235 >> auVar267;
  auVar215._8_4_ = iStack_1340 + iVar235 >> auVar267;
  auVar261 = packssdw(auVar216,auVar215);
  auVar214._4_4_ = iStack_1364 + iVar235 >> auVar268;
  auVar214._0_4_ = local_1368 + iVar235 >> auVar268;
  auVar214._12_4_ = iStack_135c + iVar235 >> auVar268;
  auVar214._8_4_ = iStack_1360 + iVar235 >> auVar268;
  auVar213._4_4_ = iStack_1384 + iVar235 >> auVar269;
  auVar213._0_4_ = local_1388 + iVar235 >> auVar269;
  auVar213._12_4_ = iStack_137c + iVar235 >> auVar269;
  auVar213._8_4_ = iStack_1380 + iVar235 >> auVar269;
  auVar267 = packssdw(auVar214,auVar213);
  local_2968 = (undefined2)uVar5;
  uStack_2966 = (undefined2)((ulong)uVar5 >> 0x10);
  uStack_2964 = (undefined2)((ulong)uVar5 >> 0x20);
  uStack_2962 = (undefined2)((ulong)uVar5 >> 0x30);
  local_2978 = auVar263._0_2_;
  uStack_2976 = auVar263._2_2_;
  uStack_2974 = auVar263._4_2_;
  uStack_2972 = auVar263._6_2_;
  uStack_26e0 = (undefined2)uVar6;
  uStack_26de = (undefined2)((ulong)uVar6 >> 0x10);
  uStack_26dc = (undefined2)((ulong)uVar6 >> 0x20);
  uStack_26da = (undefined2)((ulong)uVar6 >> 0x30);
  uStack_26f0 = auVar263._8_2_;
  uStack_26ee = auVar263._10_2_;
  uStack_26ec = auVar263._12_2_;
  uStack_26ea = auVar263._14_2_;
  auVar124._2_2_ = local_2978;
  auVar124._0_2_ = local_2968;
  auVar124._4_2_ = uStack_2966;
  auVar124._6_2_ = uStack_2976;
  auVar124._10_2_ = uStack_2974;
  auVar124._8_2_ = uStack_2964;
  auVar124._12_2_ = uStack_2962;
  auVar124._14_2_ = uStack_2972;
  auVar123._8_8_ = uVar222;
  auVar123._0_8_ = uVar221;
  auVar263 = pmaddwd(auVar124,auVar123);
  auVar122._2_2_ = uStack_26f0;
  auVar122._0_2_ = uStack_26e0;
  auVar122._4_2_ = uStack_26de;
  auVar122._6_2_ = uStack_26ee;
  auVar122._10_2_ = uStack_26ec;
  auVar122._8_2_ = uStack_26dc;
  auVar122._12_2_ = uStack_26da;
  auVar122._14_2_ = uStack_26ea;
  auVar121._8_8_ = uVar222;
  auVar121._0_8_ = uVar221;
  auVar268 = pmaddwd(auVar122,auVar121);
  auVar120._2_2_ = local_2978;
  auVar120._0_2_ = local_2968;
  auVar120._4_2_ = uStack_2966;
  auVar120._6_2_ = uStack_2976;
  auVar120._10_2_ = uStack_2974;
  auVar120._8_2_ = uStack_2964;
  auVar120._12_2_ = uStack_2962;
  auVar120._14_2_ = uStack_2972;
  auVar119._8_8_ = uVar224;
  auVar119._0_8_ = uVar223;
  auVar269 = pmaddwd(auVar120,auVar119);
  auVar118._2_2_ = uStack_26f0;
  auVar118._0_2_ = uStack_26e0;
  auVar118._4_2_ = uStack_26de;
  auVar118._6_2_ = uStack_26ee;
  auVar118._10_2_ = uStack_26ec;
  auVar118._8_2_ = uStack_26dc;
  auVar118._12_2_ = uStack_26da;
  auVar118._14_2_ = uStack_26ea;
  auVar117._8_8_ = uVar224;
  auVar117._0_8_ = uVar223;
  auVar270 = pmaddwd(auVar118,auVar117);
  local_13a8 = auVar263._0_4_;
  iStack_13a4 = auVar263._4_4_;
  iStack_13a0 = auVar263._8_4_;
  iStack_139c = auVar263._12_4_;
  local_13c8 = auVar268._0_4_;
  iStack_13c4 = auVar268._4_4_;
  iStack_13c0 = auVar268._8_4_;
  iStack_13bc = auVar268._12_4_;
  local_13e8 = auVar269._0_4_;
  iStack_13e4 = auVar269._4_4_;
  iStack_13e0 = auVar269._8_4_;
  iStack_13dc = auVar269._12_4_;
  local_1408 = auVar270._0_4_;
  iStack_1404 = auVar270._4_4_;
  iStack_1400 = auVar270._8_4_;
  iStack_13fc = auVar270._12_4_;
  auVar263 = ZEXT416((uint)(int)in_DL);
  auVar268 = ZEXT416((uint)(int)in_DL);
  auVar269 = ZEXT416((uint)(int)in_DL);
  auVar270 = ZEXT416((uint)(int)in_DL);
  auVar212._4_4_ = iStack_13a4 + iVar235 >> auVar263;
  auVar212._0_4_ = local_13a8 + iVar235 >> auVar263;
  auVar212._12_4_ = iStack_139c + iVar235 >> auVar263;
  auVar212._8_4_ = iStack_13a0 + iVar235 >> auVar263;
  auVar211._4_4_ = iStack_13c4 + iVar235 >> auVar268;
  auVar211._0_4_ = local_13c8 + iVar235 >> auVar268;
  auVar211._12_4_ = iStack_13bc + iVar235 >> auVar268;
  auVar211._8_4_ = iStack_13c0 + iVar235 >> auVar268;
  auVar263 = packssdw(auVar212,auVar211);
  auVar210._4_4_ = iStack_13e4 + iVar235 >> auVar269;
  auVar210._0_4_ = local_13e8 + iVar235 >> auVar269;
  auVar210._12_4_ = iStack_13dc + iVar235 >> auVar269;
  auVar210._8_4_ = iStack_13e0 + iVar235 >> auVar269;
  auVar209._4_4_ = iStack_1404 + iVar235 >> auVar270;
  auVar209._0_4_ = local_1408 + iVar235 >> auVar270;
  auVar209._12_4_ = iStack_13fc + iVar235 >> auVar270;
  auVar209._8_4_ = iStack_1400 + iVar235 >> auVar270;
  auVar268 = packssdw(auVar210,auVar209);
  local_2988 = auVar265._0_2_;
  uStack_2986 = auVar265._2_2_;
  uStack_2984 = auVar265._4_2_;
  uStack_2982 = auVar265._6_2_;
  local_2998 = (undefined2)uVar7;
  uStack_2996 = (undefined2)((ulong)uVar7 >> 0x10);
  uStack_2994 = (undefined2)((ulong)uVar7 >> 0x20);
  uStack_2992 = (undefined2)((ulong)uVar7 >> 0x30);
  uStack_2700 = auVar265._8_2_;
  uStack_26fe = auVar265._10_2_;
  uStack_26fc = auVar265._12_2_;
  uStack_26fa = auVar265._14_2_;
  uStack_2710 = (undefined2)uVar8;
  uStack_270e = (undefined2)((ulong)uVar8 >> 0x10);
  uStack_270c = (undefined2)((ulong)uVar8 >> 0x20);
  uStack_270a = (undefined2)((ulong)uVar8 >> 0x30);
  auVar116._2_2_ = local_2998;
  auVar116._0_2_ = local_2988;
  auVar116._4_2_ = uStack_2986;
  auVar116._6_2_ = uStack_2996;
  auVar116._10_2_ = uStack_2994;
  auVar116._8_2_ = uStack_2984;
  auVar116._12_2_ = uStack_2982;
  auVar116._14_2_ = uStack_2992;
  auVar115._8_8_ = uVar222;
  auVar115._0_8_ = uVar221;
  auVar265 = pmaddwd(auVar116,auVar115);
  auVar114._2_2_ = uStack_2710;
  auVar114._0_2_ = uStack_2700;
  auVar114._4_2_ = uStack_26fe;
  auVar114._6_2_ = uStack_270e;
  auVar114._10_2_ = uStack_270c;
  auVar114._8_2_ = uStack_26fc;
  auVar114._12_2_ = uStack_26fa;
  auVar114._14_2_ = uStack_270a;
  auVar113._8_8_ = uVar222;
  auVar113._0_8_ = uVar221;
  auVar269 = pmaddwd(auVar114,auVar113);
  auVar112._2_2_ = local_2998;
  auVar112._0_2_ = local_2988;
  auVar112._4_2_ = uStack_2986;
  auVar112._6_2_ = uStack_2996;
  auVar112._10_2_ = uStack_2994;
  auVar112._8_2_ = uStack_2984;
  auVar112._12_2_ = uStack_2982;
  auVar112._14_2_ = uStack_2992;
  auVar111._8_8_ = uVar224;
  auVar111._0_8_ = uVar223;
  auVar270 = pmaddwd(auVar112,auVar111);
  auVar110._2_2_ = uStack_2710;
  auVar110._0_2_ = uStack_2700;
  auVar110._4_2_ = uStack_26fe;
  auVar110._6_2_ = uStack_270e;
  auVar110._10_2_ = uStack_270c;
  auVar110._8_2_ = uStack_26fc;
  auVar110._12_2_ = uStack_26fa;
  auVar110._14_2_ = uStack_270a;
  auVar109._8_8_ = uVar224;
  auVar109._0_8_ = uVar223;
  auVar271 = pmaddwd(auVar110,auVar109);
  local_1428 = auVar265._0_4_;
  iStack_1424 = auVar265._4_4_;
  iStack_1420 = auVar265._8_4_;
  iStack_141c = auVar265._12_4_;
  local_1448 = auVar269._0_4_;
  iStack_1444 = auVar269._4_4_;
  iStack_1440 = auVar269._8_4_;
  iStack_143c = auVar269._12_4_;
  local_1468 = auVar270._0_4_;
  iStack_1464 = auVar270._4_4_;
  iStack_1460 = auVar270._8_4_;
  iStack_145c = auVar270._12_4_;
  local_1488 = auVar271._0_4_;
  iStack_1484 = auVar271._4_4_;
  iStack_1480 = auVar271._8_4_;
  iStack_147c = auVar271._12_4_;
  auVar265 = ZEXT416((uint)(int)in_DL);
  auVar269 = ZEXT416((uint)(int)in_DL);
  auVar270 = ZEXT416((uint)(int)in_DL);
  auVar271 = ZEXT416((uint)(int)in_DL);
  auVar208._4_4_ = iStack_1424 + iVar235 >> auVar265;
  auVar208._0_4_ = local_1428 + iVar235 >> auVar265;
  auVar208._12_4_ = iStack_141c + iVar235 >> auVar265;
  auVar208._8_4_ = iStack_1420 + iVar235 >> auVar265;
  auVar207._4_4_ = iStack_1444 + iVar235 >> auVar269;
  auVar207._0_4_ = local_1448 + iVar235 >> auVar269;
  auVar207._12_4_ = iStack_143c + iVar235 >> auVar269;
  auVar207._8_4_ = iStack_1440 + iVar235 >> auVar269;
  auVar265 = packssdw(auVar208,auVar207);
  auVar206._4_4_ = iStack_1464 + iVar235 >> auVar270;
  auVar206._0_4_ = local_1468 + iVar235 >> auVar270;
  auVar206._12_4_ = iStack_145c + iVar235 >> auVar270;
  auVar206._8_4_ = iStack_1460 + iVar235 >> auVar270;
  auVar205._4_4_ = iStack_1484 + iVar235 >> auVar271;
  auVar205._0_4_ = local_1488 + iVar235 >> auVar271;
  auVar205._12_4_ = iStack_147c + iVar235 >> auVar271;
  auVar205._8_4_ = iStack_1480 + iVar235 >> auVar271;
  auVar269 = packssdw(auVar206,auVar205);
  auVar270 = paddsw(*in_RDI,auVar259);
  auVar259 = psubsw(*in_RDI,auVar259);
  auVar271 = paddsw(auVar258,auVar266);
  auVar258 = psubsw(auVar258,auVar266);
  auVar266 = paddsw(auVar260,auVar261);
  auVar260 = psubsw(auVar260,auVar261);
  auVar261 = paddsw(in_RDI[0xc],auVar267);
  auVar267 = psubsw(in_RDI[0xc],auVar267);
  auVar272 = paddsw(auVar262,auVar263);
  auVar262 = psubsw(auVar262,auVar263);
  auVar263 = paddsw(in_RDI[0xe],auVar268);
  auVar268 = psubsw(in_RDI[0xe],auVar268);
  auVar273 = paddsw(in_RDI[2],auVar265);
  auVar265 = psubsw(in_RDI[2],auVar265);
  auVar274 = paddsw(auVar264,auVar269);
  auVar264 = psubsw(auVar264,auVar269);
  local_29a8 = auVar266._0_2_;
  uStack_29a6 = auVar266._2_2_;
  uStack_29a4 = auVar266._4_2_;
  uStack_29a2 = auVar266._6_2_;
  local_29b8 = auVar261._0_2_;
  uStack_29b6 = auVar261._2_2_;
  uStack_29b4 = auVar261._4_2_;
  uStack_29b2 = auVar261._6_2_;
  uStack_2720 = auVar266._8_2_;
  uStack_271e = auVar266._10_2_;
  uStack_271c = auVar266._12_2_;
  uStack_271a = auVar266._14_2_;
  uStack_2730 = auVar261._8_2_;
  uStack_272e = auVar261._10_2_;
  uStack_272c = auVar261._12_2_;
  uStack_272a = auVar261._14_2_;
  auVar108._2_2_ = local_29b8;
  auVar108._0_2_ = local_29a8;
  auVar108._4_2_ = uStack_29a6;
  auVar108._6_2_ = uStack_29b6;
  auVar108._10_2_ = uStack_29b4;
  auVar108._8_2_ = uStack_29a4;
  auVar108._12_2_ = uStack_29a2;
  auVar108._14_2_ = uStack_29b2;
  auVar107._8_8_ = uVar226;
  auVar107._0_8_ = uVar225;
  auVar261 = pmaddwd(auVar108,auVar107);
  auVar106._2_2_ = uStack_2730;
  auVar106._0_2_ = uStack_2720;
  auVar106._4_2_ = uStack_271e;
  auVar106._6_2_ = uStack_272e;
  auVar106._10_2_ = uStack_272c;
  auVar106._8_2_ = uStack_271c;
  auVar106._12_2_ = uStack_271a;
  auVar106._14_2_ = uStack_272a;
  auVar105._8_8_ = uVar226;
  auVar105._0_8_ = uVar225;
  auVar266 = pmaddwd(auVar106,auVar105);
  auVar104._2_2_ = local_29b8;
  auVar104._0_2_ = local_29a8;
  auVar104._4_2_ = uStack_29a6;
  auVar104._6_2_ = uStack_29b6;
  auVar104._10_2_ = uStack_29b4;
  auVar104._8_2_ = uStack_29a4;
  auVar104._12_2_ = uStack_29a2;
  auVar104._14_2_ = uStack_29b2;
  auVar103._8_8_ = uVar228;
  auVar103._0_8_ = uVar227;
  auVar269 = pmaddwd(auVar104,auVar103);
  auVar102._2_2_ = uStack_2730;
  auVar102._0_2_ = uStack_2720;
  auVar102._4_2_ = uStack_271e;
  auVar102._6_2_ = uStack_272e;
  auVar102._10_2_ = uStack_272c;
  auVar102._8_2_ = uStack_271c;
  auVar102._12_2_ = uStack_271a;
  auVar102._14_2_ = uStack_272a;
  auVar101._8_8_ = uVar228;
  auVar101._0_8_ = uVar227;
  auVar275 = pmaddwd(auVar102,auVar101);
  local_14a8 = auVar261._0_4_;
  iStack_14a4 = auVar261._4_4_;
  iStack_14a0 = auVar261._8_4_;
  iStack_149c = auVar261._12_4_;
  local_14c8 = auVar266._0_4_;
  iStack_14c4 = auVar266._4_4_;
  iStack_14c0 = auVar266._8_4_;
  iStack_14bc = auVar266._12_4_;
  local_14e8 = auVar269._0_4_;
  iStack_14e4 = auVar269._4_4_;
  iStack_14e0 = auVar269._8_4_;
  iStack_14dc = auVar269._12_4_;
  local_1508 = auVar275._0_4_;
  iStack_1504 = auVar275._4_4_;
  iStack_1500 = auVar275._8_4_;
  iStack_14fc = auVar275._12_4_;
  auVar261 = ZEXT416((uint)(int)in_DL);
  auVar266 = ZEXT416((uint)(int)in_DL);
  auVar269 = ZEXT416((uint)(int)in_DL);
  auVar275 = ZEXT416((uint)(int)in_DL);
  auVar204._4_4_ = iStack_14a4 + iVar235 >> auVar261;
  auVar204._0_4_ = local_14a8 + iVar235 >> auVar261;
  auVar204._12_4_ = iStack_149c + iVar235 >> auVar261;
  auVar204._8_4_ = iStack_14a0 + iVar235 >> auVar261;
  auVar203._4_4_ = iStack_14c4 + iVar235 >> auVar266;
  auVar203._0_4_ = local_14c8 + iVar235 >> auVar266;
  auVar203._12_4_ = iStack_14bc + iVar235 >> auVar266;
  auVar203._8_4_ = iStack_14c0 + iVar235 >> auVar266;
  auVar261 = packssdw(auVar204,auVar203);
  auVar202._4_4_ = iStack_14e4 + iVar235 >> auVar269;
  auVar202._0_4_ = local_14e8 + iVar235 >> auVar269;
  auVar202._12_4_ = iStack_14dc + iVar235 >> auVar269;
  auVar202._8_4_ = iStack_14e0 + iVar235 >> auVar269;
  auVar201._4_4_ = iStack_1504 + iVar235 >> auVar275;
  auVar201._0_4_ = local_1508 + iVar235 >> auVar275;
  auVar201._12_4_ = iStack_14fc + iVar235 >> auVar275;
  auVar201._8_4_ = iStack_1500 + iVar235 >> auVar275;
  auVar266 = packssdw(auVar202,auVar201);
  local_29c8 = auVar260._0_2_;
  uStack_29c6 = auVar260._2_2_;
  uStack_29c4 = auVar260._4_2_;
  uStack_29c2 = auVar260._6_2_;
  local_29d8 = auVar267._0_2_;
  uStack_29d6 = auVar267._2_2_;
  uStack_29d4 = auVar267._4_2_;
  uStack_29d2 = auVar267._6_2_;
  uStack_2740 = auVar260._8_2_;
  uStack_273e = auVar260._10_2_;
  uStack_273c = auVar260._12_2_;
  uStack_273a = auVar260._14_2_;
  uStack_2750 = auVar267._8_2_;
  uStack_274e = auVar267._10_2_;
  uStack_274c = auVar267._12_2_;
  uStack_274a = auVar267._14_2_;
  auVar100._2_2_ = local_29d8;
  auVar100._0_2_ = local_29c8;
  auVar100._4_2_ = uStack_29c6;
  auVar100._6_2_ = uStack_29d6;
  auVar100._10_2_ = uStack_29d4;
  auVar100._8_2_ = uStack_29c4;
  auVar100._12_2_ = uStack_29c2;
  auVar100._14_2_ = uStack_29d2;
  auVar99._8_8_ = uVar230;
  auVar99._0_8_ = uVar229;
  auVar260 = pmaddwd(auVar100,auVar99);
  auVar98._2_2_ = uStack_2750;
  auVar98._0_2_ = uStack_2740;
  auVar98._4_2_ = uStack_273e;
  auVar98._6_2_ = uStack_274e;
  auVar98._10_2_ = uStack_274c;
  auVar98._8_2_ = uStack_273c;
  auVar98._12_2_ = uStack_273a;
  auVar98._14_2_ = uStack_274a;
  auVar97._8_8_ = uVar230;
  auVar97._0_8_ = uVar229;
  auVar267 = pmaddwd(auVar98,auVar97);
  auVar96._2_2_ = local_29d8;
  auVar96._0_2_ = local_29c8;
  auVar96._4_2_ = uStack_29c6;
  auVar96._6_2_ = uStack_29d6;
  auVar96._10_2_ = uStack_29d4;
  auVar96._8_2_ = uStack_29c4;
  auVar96._12_2_ = uStack_29c2;
  auVar96._14_2_ = uStack_29d2;
  auVar95._8_8_ = uVar226;
  auVar95._0_8_ = uVar225;
  auVar269 = pmaddwd(auVar96,auVar95);
  auVar94._2_2_ = uStack_2750;
  auVar94._0_2_ = uStack_2740;
  auVar94._4_2_ = uStack_273e;
  auVar94._6_2_ = uStack_274e;
  auVar94._10_2_ = uStack_274c;
  auVar94._8_2_ = uStack_273c;
  auVar94._12_2_ = uStack_273a;
  auVar94._14_2_ = uStack_274a;
  auVar93._8_8_ = uVar226;
  auVar93._0_8_ = uVar225;
  auVar275 = pmaddwd(auVar94,auVar93);
  local_1528 = auVar260._0_4_;
  iStack_1524 = auVar260._4_4_;
  iStack_1520 = auVar260._8_4_;
  iStack_151c = auVar260._12_4_;
  local_1548 = auVar267._0_4_;
  iStack_1544 = auVar267._4_4_;
  iStack_1540 = auVar267._8_4_;
  iStack_153c = auVar267._12_4_;
  local_1568 = auVar269._0_4_;
  iStack_1564 = auVar269._4_4_;
  iStack_1560 = auVar269._8_4_;
  iStack_155c = auVar269._12_4_;
  local_1588 = auVar275._0_4_;
  iStack_1584 = auVar275._4_4_;
  iStack_1580 = auVar275._8_4_;
  iStack_157c = auVar275._12_4_;
  auVar260 = ZEXT416((uint)(int)in_DL);
  auVar267 = ZEXT416((uint)(int)in_DL);
  auVar269 = ZEXT416((uint)(int)in_DL);
  auVar275 = ZEXT416((uint)(int)in_DL);
  auVar200._4_4_ = iStack_1524 + iVar235 >> auVar260;
  auVar200._0_4_ = local_1528 + iVar235 >> auVar260;
  auVar200._12_4_ = iStack_151c + iVar235 >> auVar260;
  auVar200._8_4_ = iStack_1520 + iVar235 >> auVar260;
  auVar199._4_4_ = iStack_1544 + iVar235 >> auVar267;
  auVar199._0_4_ = local_1548 + iVar235 >> auVar267;
  auVar199._12_4_ = iStack_153c + iVar235 >> auVar267;
  auVar199._8_4_ = iStack_1540 + iVar235 >> auVar267;
  auVar260 = packssdw(auVar200,auVar199);
  auVar198._4_4_ = iStack_1564 + iVar235 >> auVar269;
  auVar198._0_4_ = local_1568 + iVar235 >> auVar269;
  auVar198._12_4_ = iStack_155c + iVar235 >> auVar269;
  auVar198._8_4_ = iStack_1560 + iVar235 >> auVar269;
  auVar197._4_4_ = iStack_1584 + iVar235 >> auVar275;
  auVar197._0_4_ = local_1588 + iVar235 >> auVar275;
  auVar197._12_4_ = iStack_157c + iVar235 >> auVar275;
  auVar197._8_4_ = iStack_1580 + iVar235 >> auVar275;
  auVar267 = packssdw(auVar198,auVar197);
  local_29e8 = auVar273._0_2_;
  uStack_29e6 = auVar273._2_2_;
  uStack_29e4 = auVar273._4_2_;
  uStack_29e2 = auVar273._6_2_;
  local_29f8 = auVar274._0_2_;
  uStack_29f6 = auVar274._2_2_;
  uStack_29f4 = auVar274._4_2_;
  uStack_29f2 = auVar274._6_2_;
  uStack_2760 = auVar273._8_2_;
  uStack_275e = auVar273._10_2_;
  uStack_275c = auVar273._12_2_;
  uStack_275a = auVar273._14_2_;
  uStack_2770 = auVar274._8_2_;
  uStack_276e = auVar274._10_2_;
  uStack_276c = auVar274._12_2_;
  uStack_276a = auVar274._14_2_;
  auVar92._2_2_ = local_29f8;
  auVar92._0_2_ = local_29e8;
  auVar92._4_2_ = uStack_29e6;
  auVar92._6_2_ = uStack_29f6;
  auVar92._10_2_ = uStack_29f4;
  auVar92._8_2_ = uStack_29e4;
  auVar92._12_2_ = uStack_29e2;
  auVar92._14_2_ = uStack_29f2;
  auVar91._8_8_ = uVar226;
  auVar91._0_8_ = uVar225;
  auVar269 = pmaddwd(auVar92,auVar91);
  auVar90._2_2_ = uStack_2770;
  auVar90._0_2_ = uStack_2760;
  auVar90._4_2_ = uStack_275e;
  auVar90._6_2_ = uStack_276e;
  auVar90._10_2_ = uStack_276c;
  auVar90._8_2_ = uStack_275c;
  auVar90._12_2_ = uStack_275a;
  auVar90._14_2_ = uStack_276a;
  auVar89._8_8_ = uVar226;
  auVar89._0_8_ = uVar225;
  auVar273 = pmaddwd(auVar90,auVar89);
  auVar88._2_2_ = local_29f8;
  auVar88._0_2_ = local_29e8;
  auVar88._4_2_ = uStack_29e6;
  auVar88._6_2_ = uStack_29f6;
  auVar88._10_2_ = uStack_29f4;
  auVar88._8_2_ = uStack_29e4;
  auVar88._12_2_ = uStack_29e2;
  auVar88._14_2_ = uStack_29f2;
  auVar87._8_8_ = uVar228;
  auVar87._0_8_ = uVar227;
  auVar274 = pmaddwd(auVar88,auVar87);
  auVar86._2_2_ = uStack_2770;
  auVar86._0_2_ = uStack_2760;
  auVar86._4_2_ = uStack_275e;
  auVar86._6_2_ = uStack_276e;
  auVar86._10_2_ = uStack_276c;
  auVar86._8_2_ = uStack_275c;
  auVar86._12_2_ = uStack_275a;
  auVar86._14_2_ = uStack_276a;
  auVar85._8_8_ = uVar228;
  auVar85._0_8_ = uVar227;
  auVar275 = pmaddwd(auVar86,auVar85);
  local_15a8 = auVar269._0_4_;
  iStack_15a4 = auVar269._4_4_;
  iStack_15a0 = auVar269._8_4_;
  iStack_159c = auVar269._12_4_;
  local_15c8 = auVar273._0_4_;
  iStack_15c4 = auVar273._4_4_;
  iStack_15c0 = auVar273._8_4_;
  iStack_15bc = auVar273._12_4_;
  local_15e8 = auVar274._0_4_;
  iStack_15e4 = auVar274._4_4_;
  iStack_15e0 = auVar274._8_4_;
  iStack_15dc = auVar274._12_4_;
  local_1608 = auVar275._0_4_;
  iStack_1604 = auVar275._4_4_;
  iStack_1600 = auVar275._8_4_;
  iStack_15fc = auVar275._12_4_;
  auVar269 = ZEXT416((uint)(int)in_DL);
  auVar273 = ZEXT416((uint)(int)in_DL);
  auVar274 = ZEXT416((uint)(int)in_DL);
  auVar275 = ZEXT416((uint)(int)in_DL);
  auVar196._4_4_ = iStack_15a4 + iVar235 >> auVar269;
  auVar196._0_4_ = local_15a8 + iVar235 >> auVar269;
  auVar196._12_4_ = iStack_159c + iVar235 >> auVar269;
  auVar196._8_4_ = iStack_15a0 + iVar235 >> auVar269;
  auVar195._4_4_ = iStack_15c4 + iVar235 >> auVar273;
  auVar195._0_4_ = local_15c8 + iVar235 >> auVar273;
  auVar195._12_4_ = iStack_15bc + iVar235 >> auVar273;
  auVar195._8_4_ = iStack_15c0 + iVar235 >> auVar273;
  auVar269 = packssdw(auVar196,auVar195);
  auVar194._4_4_ = iStack_15e4 + iVar235 >> auVar274;
  auVar194._0_4_ = local_15e8 + iVar235 >> auVar274;
  auVar194._12_4_ = iStack_15dc + iVar235 >> auVar274;
  auVar194._8_4_ = iStack_15e0 + iVar235 >> auVar274;
  auVar193._4_4_ = iStack_1604 + iVar235 >> auVar275;
  auVar193._0_4_ = local_1608 + iVar235 >> auVar275;
  auVar193._12_4_ = iStack_15fc + iVar235 >> auVar275;
  auVar193._8_4_ = iStack_1600 + iVar235 >> auVar275;
  auVar273 = packssdw(auVar194,auVar193);
  local_2a08 = auVar265._0_2_;
  uStack_2a06 = auVar265._2_2_;
  uStack_2a04 = auVar265._4_2_;
  uStack_2a02 = auVar265._6_2_;
  local_2a18 = auVar264._0_2_;
  uStack_2a16 = auVar264._2_2_;
  uStack_2a14 = auVar264._4_2_;
  uStack_2a12 = auVar264._6_2_;
  uStack_2780 = auVar265._8_2_;
  uStack_277e = auVar265._10_2_;
  uStack_277c = auVar265._12_2_;
  uStack_277a = auVar265._14_2_;
  uStack_2790 = auVar264._8_2_;
  uStack_278e = auVar264._10_2_;
  uStack_278c = auVar264._12_2_;
  uStack_278a = auVar264._14_2_;
  auVar84._2_2_ = local_2a18;
  auVar84._0_2_ = local_2a08;
  auVar84._4_2_ = uStack_2a06;
  auVar84._6_2_ = uStack_2a16;
  auVar84._10_2_ = uStack_2a14;
  auVar84._8_2_ = uStack_2a04;
  auVar84._12_2_ = uStack_2a02;
  auVar84._14_2_ = uStack_2a12;
  auVar83._8_8_ = uVar230;
  auVar83._0_8_ = uVar229;
  auVar264 = pmaddwd(auVar84,auVar83);
  auVar82._2_2_ = uStack_2790;
  auVar82._0_2_ = uStack_2780;
  auVar82._4_2_ = uStack_277e;
  auVar82._6_2_ = uStack_278e;
  auVar82._10_2_ = uStack_278c;
  auVar82._8_2_ = uStack_277c;
  auVar82._12_2_ = uStack_277a;
  auVar82._14_2_ = uStack_278a;
  auVar81._8_8_ = uVar230;
  auVar81._0_8_ = uVar229;
  auVar265 = pmaddwd(auVar82,auVar81);
  auVar80._2_2_ = local_2a18;
  auVar80._0_2_ = local_2a08;
  auVar80._4_2_ = uStack_2a06;
  auVar80._6_2_ = uStack_2a16;
  auVar80._10_2_ = uStack_2a14;
  auVar80._8_2_ = uStack_2a04;
  auVar80._12_2_ = uStack_2a02;
  auVar80._14_2_ = uStack_2a12;
  auVar79._8_8_ = uVar226;
  auVar79._0_8_ = uVar225;
  auVar274 = pmaddwd(auVar80,auVar79);
  auVar78._2_2_ = uStack_2790;
  auVar78._0_2_ = uStack_2780;
  auVar78._4_2_ = uStack_277e;
  auVar78._6_2_ = uStack_278e;
  auVar78._10_2_ = uStack_278c;
  auVar78._8_2_ = uStack_277c;
  auVar78._12_2_ = uStack_277a;
  auVar78._14_2_ = uStack_278a;
  auVar77._8_8_ = uVar226;
  auVar77._0_8_ = uVar225;
  auVar275 = pmaddwd(auVar78,auVar77);
  local_1628 = auVar264._0_4_;
  iStack_1624 = auVar264._4_4_;
  iStack_1620 = auVar264._8_4_;
  iStack_161c = auVar264._12_4_;
  local_1648 = auVar265._0_4_;
  iStack_1644 = auVar265._4_4_;
  iStack_1640 = auVar265._8_4_;
  iStack_163c = auVar265._12_4_;
  local_1668 = auVar274._0_4_;
  iStack_1664 = auVar274._4_4_;
  iStack_1660 = auVar274._8_4_;
  iStack_165c = auVar274._12_4_;
  local_1688 = auVar275._0_4_;
  iStack_1684 = auVar275._4_4_;
  iStack_1680 = auVar275._8_4_;
  iStack_167c = auVar275._12_4_;
  auVar264 = ZEXT416((uint)(int)in_DL);
  auVar265 = ZEXT416((uint)(int)in_DL);
  auVar274 = ZEXT416((uint)(int)in_DL);
  auVar275 = ZEXT416((uint)(int)in_DL);
  auVar192._4_4_ = iStack_1624 + iVar235 >> auVar264;
  auVar192._0_4_ = local_1628 + iVar235 >> auVar264;
  auVar192._12_4_ = iStack_161c + iVar235 >> auVar264;
  auVar192._8_4_ = iStack_1620 + iVar235 >> auVar264;
  auVar191._4_4_ = iStack_1644 + iVar235 >> auVar265;
  auVar191._0_4_ = local_1648 + iVar235 >> auVar265;
  auVar191._12_4_ = iStack_163c + iVar235 >> auVar265;
  auVar191._8_4_ = iStack_1640 + iVar235 >> auVar265;
  auVar264 = packssdw(auVar192,auVar191);
  auVar190._4_4_ = iStack_1664 + iVar235 >> auVar274;
  auVar190._0_4_ = local_1668 + iVar235 >> auVar274;
  auVar190._12_4_ = iStack_165c + iVar235 >> auVar274;
  auVar190._8_4_ = iStack_1660 + iVar235 >> auVar274;
  auVar189._4_4_ = iStack_1684 + iVar235 >> auVar275;
  auVar189._0_4_ = local_1688 + iVar235 >> auVar275;
  auVar189._12_4_ = iStack_167c + iVar235 >> auVar275;
  auVar189._8_4_ = iStack_1680 + iVar235 >> auVar275;
  auVar265 = packssdw(auVar190,auVar189);
  auVar274 = paddsw(auVar270,auVar261);
  auVar261 = psubsw(auVar270,auVar261);
  auVar270 = paddsw(auVar271,auVar266);
  auVar266 = psubsw(auVar271,auVar266);
  auVar271 = paddsw(auVar259,auVar260);
  auVar259 = psubsw(auVar259,auVar260);
  auVar260 = paddsw(auVar258,auVar267);
  auVar258 = psubsw(auVar258,auVar267);
  auVar267 = paddsw(auVar272,auVar269);
  auVar269 = psubsw(auVar272,auVar269);
  auVar272 = paddsw(auVar263,auVar273);
  auVar263 = psubsw(auVar263,auVar273);
  auVar273 = paddsw(auVar262,auVar264);
  auVar262 = psubsw(auVar262,auVar264);
  auVar264 = paddsw(auVar268,auVar265);
  auVar265 = psubsw(auVar268,auVar265);
  local_2a28 = auVar267._0_2_;
  uStack_2a26 = auVar267._2_2_;
  uStack_2a24 = auVar267._4_2_;
  uStack_2a22 = auVar267._6_2_;
  local_2a38 = auVar272._0_2_;
  uStack_2a36 = auVar272._2_2_;
  uStack_2a34 = auVar272._4_2_;
  uStack_2a32 = auVar272._6_2_;
  uStack_27a0 = auVar267._8_2_;
  uStack_279e = auVar267._10_2_;
  uStack_279c = auVar267._12_2_;
  uStack_279a = auVar267._14_2_;
  uStack_27b0 = auVar272._8_2_;
  uStack_27ae = auVar272._10_2_;
  uStack_27ac = auVar272._12_2_;
  uStack_27aa = auVar272._14_2_;
  auVar76._2_2_ = local_2a38;
  auVar76._0_2_ = local_2a28;
  auVar76._4_2_ = uStack_2a26;
  auVar76._6_2_ = uStack_2a36;
  auVar76._10_2_ = uStack_2a34;
  auVar76._8_2_ = uStack_2a24;
  auVar76._12_2_ = uStack_2a22;
  auVar76._14_2_ = uStack_2a32;
  auVar75._8_8_ = uVar232;
  auVar75._0_8_ = uVar231;
  auVar267 = pmaddwd(auVar76,auVar75);
  auVar74._2_2_ = uStack_27b0;
  auVar74._0_2_ = uStack_27a0;
  auVar74._4_2_ = uStack_279e;
  auVar74._6_2_ = uStack_27ae;
  auVar74._10_2_ = uStack_27ac;
  auVar74._8_2_ = uStack_279c;
  auVar74._12_2_ = uStack_279a;
  auVar74._14_2_ = uStack_27aa;
  auVar73._8_8_ = uVar232;
  auVar73._0_8_ = uVar231;
  auVar268 = pmaddwd(auVar74,auVar73);
  auVar72._2_2_ = local_2a38;
  auVar72._0_2_ = local_2a28;
  auVar72._4_2_ = uStack_2a26;
  auVar72._6_2_ = uStack_2a36;
  auVar72._10_2_ = uStack_2a34;
  auVar72._8_2_ = uStack_2a24;
  auVar72._12_2_ = uStack_2a22;
  auVar72._14_2_ = uStack_2a32;
  auVar71._8_8_ = CONCAT44(iVar237,iVar237);
  auVar71._0_8_ = CONCAT44(iVar237,iVar237);
  auVar272 = pmaddwd(auVar72,auVar71);
  auVar70._2_2_ = uStack_27b0;
  auVar70._0_2_ = uStack_27a0;
  auVar70._4_2_ = uStack_279e;
  auVar70._6_2_ = uStack_27ae;
  auVar70._10_2_ = uStack_27ac;
  auVar70._8_2_ = uStack_279c;
  auVar70._12_2_ = uStack_279a;
  auVar70._14_2_ = uStack_27aa;
  auVar69._8_8_ = CONCAT44(iVar237,iVar237);
  auVar69._0_8_ = CONCAT44(iVar237,iVar237);
  auVar275 = pmaddwd(auVar70,auVar69);
  local_16a8 = auVar267._0_4_;
  iStack_16a4 = auVar267._4_4_;
  iStack_16a0 = auVar267._8_4_;
  iStack_169c = auVar267._12_4_;
  local_16c8 = auVar268._0_4_;
  iStack_16c4 = auVar268._4_4_;
  iStack_16c0 = auVar268._8_4_;
  iStack_16bc = auVar268._12_4_;
  local_16e8 = auVar272._0_4_;
  iStack_16e4 = auVar272._4_4_;
  iStack_16e0 = auVar272._8_4_;
  iStack_16dc = auVar272._12_4_;
  local_1708 = auVar275._0_4_;
  iStack_1704 = auVar275._4_4_;
  iStack_1700 = auVar275._8_4_;
  iStack_16fc = auVar275._12_4_;
  auVar267 = ZEXT416((uint)(int)in_DL);
  auVar268 = ZEXT416((uint)(int)in_DL);
  auVar272 = ZEXT416((uint)(int)in_DL);
  auVar275 = ZEXT416((uint)(int)in_DL);
  auVar188._4_4_ = iStack_16a4 + iVar235 >> auVar267;
  auVar188._0_4_ = local_16a8 + iVar235 >> auVar267;
  auVar188._12_4_ = iStack_169c + iVar235 >> auVar267;
  auVar188._8_4_ = iStack_16a0 + iVar235 >> auVar267;
  auVar187._4_4_ = iStack_16c4 + iVar235 >> auVar268;
  auVar187._0_4_ = local_16c8 + iVar235 >> auVar268;
  auVar187._12_4_ = iStack_16bc + iVar235 >> auVar268;
  auVar187._8_4_ = iStack_16c0 + iVar235 >> auVar268;
  auVar267 = packssdw(auVar188,auVar187);
  auVar186._4_4_ = iStack_16e4 + iVar235 >> auVar272;
  auVar186._0_4_ = local_16e8 + iVar235 >> auVar272;
  auVar186._12_4_ = iStack_16dc + iVar235 >> auVar272;
  auVar186._8_4_ = iStack_16e0 + iVar235 >> auVar272;
  auVar185._4_4_ = iStack_1704 + iVar235 >> auVar275;
  auVar185._0_4_ = local_1708 + iVar235 >> auVar275;
  auVar185._12_4_ = iStack_16fc + iVar235 >> auVar275;
  auVar185._8_4_ = iStack_1700 + iVar235 >> auVar275;
  auVar268 = packssdw(auVar186,auVar185);
  local_2a48 = auVar273._0_2_;
  uStack_2a46 = auVar273._2_2_;
  uStack_2a44 = auVar273._4_2_;
  uStack_2a42 = auVar273._6_2_;
  local_2a58 = auVar264._0_2_;
  uStack_2a56 = auVar264._2_2_;
  uStack_2a54 = auVar264._4_2_;
  uStack_2a52 = auVar264._6_2_;
  uStack_27c0 = auVar273._8_2_;
  uStack_27be = auVar273._10_2_;
  uStack_27bc = auVar273._12_2_;
  uStack_27ba = auVar273._14_2_;
  uStack_27d0 = auVar264._8_2_;
  uStack_27ce = auVar264._10_2_;
  uStack_27cc = auVar264._12_2_;
  uStack_27ca = auVar264._14_2_;
  auVar68._2_2_ = local_2a58;
  auVar68._0_2_ = local_2a48;
  auVar68._4_2_ = uStack_2a46;
  auVar68._6_2_ = uStack_2a56;
  auVar68._10_2_ = uStack_2a54;
  auVar68._8_2_ = uStack_2a44;
  auVar68._12_2_ = uStack_2a42;
  auVar68._14_2_ = uStack_2a52;
  auVar67._8_8_ = uVar234;
  auVar67._0_8_ = uVar233;
  auVar264 = pmaddwd(auVar68,auVar67);
  auVar66._2_2_ = uStack_27d0;
  auVar66._0_2_ = uStack_27c0;
  auVar66._4_2_ = uStack_27be;
  auVar66._6_2_ = uStack_27ce;
  auVar66._10_2_ = uStack_27cc;
  auVar66._8_2_ = uStack_27bc;
  auVar66._12_2_ = uStack_27ba;
  auVar66._14_2_ = uStack_27ca;
  auVar65._8_8_ = uVar234;
  auVar65._0_8_ = uVar233;
  auVar272 = pmaddwd(auVar66,auVar65);
  auVar64._2_2_ = local_2a58;
  auVar64._0_2_ = local_2a48;
  auVar64._4_2_ = uStack_2a46;
  auVar64._6_2_ = uStack_2a56;
  auVar64._10_2_ = uStack_2a54;
  auVar64._8_2_ = uStack_2a44;
  auVar64._12_2_ = uStack_2a42;
  auVar64._14_2_ = uStack_2a52;
  auVar63._8_8_ = CONCAT44(iVar239,iVar239);
  auVar63._0_8_ = CONCAT44(iVar239,iVar239);
  auVar273 = pmaddwd(auVar64,auVar63);
  auVar62._2_2_ = uStack_27d0;
  auVar62._0_2_ = uStack_27c0;
  auVar62._4_2_ = uStack_27be;
  auVar62._6_2_ = uStack_27ce;
  auVar62._10_2_ = uStack_27cc;
  auVar62._8_2_ = uStack_27bc;
  auVar62._12_2_ = uStack_27ba;
  auVar62._14_2_ = uStack_27ca;
  auVar61._8_8_ = CONCAT44(iVar239,iVar239);
  auVar61._0_8_ = CONCAT44(iVar239,iVar239);
  auVar275 = pmaddwd(auVar62,auVar61);
  local_1728 = auVar264._0_4_;
  iStack_1724 = auVar264._4_4_;
  iStack_1720 = auVar264._8_4_;
  iStack_171c = auVar264._12_4_;
  local_1748 = auVar272._0_4_;
  iStack_1744 = auVar272._4_4_;
  iStack_1740 = auVar272._8_4_;
  iStack_173c = auVar272._12_4_;
  local_1768 = auVar273._0_4_;
  iStack_1764 = auVar273._4_4_;
  iStack_1760 = auVar273._8_4_;
  iStack_175c = auVar273._12_4_;
  local_1788 = auVar275._0_4_;
  iStack_1784 = auVar275._4_4_;
  iStack_1780 = auVar275._8_4_;
  iStack_177c = auVar275._12_4_;
  auVar264 = ZEXT416((uint)(int)in_DL);
  auVar272 = ZEXT416((uint)(int)in_DL);
  auVar273 = ZEXT416((uint)(int)in_DL);
  auVar275 = ZEXT416((uint)(int)in_DL);
  auVar184._4_4_ = iStack_1724 + iVar235 >> auVar264;
  auVar184._0_4_ = local_1728 + iVar235 >> auVar264;
  auVar184._12_4_ = iStack_171c + iVar235 >> auVar264;
  auVar184._8_4_ = iStack_1720 + iVar235 >> auVar264;
  auVar183._4_4_ = iStack_1744 + iVar235 >> auVar272;
  auVar183._0_4_ = local_1748 + iVar235 >> auVar272;
  auVar183._12_4_ = iStack_173c + iVar235 >> auVar272;
  auVar183._8_4_ = iStack_1740 + iVar235 >> auVar272;
  auVar264 = packssdw(auVar184,auVar183);
  auVar182._4_4_ = iStack_1764 + iVar235 >> auVar273;
  auVar182._0_4_ = local_1768 + iVar235 >> auVar273;
  auVar182._12_4_ = iStack_175c + iVar235 >> auVar273;
  auVar182._8_4_ = iStack_1760 + iVar235 >> auVar273;
  auVar181._4_4_ = iStack_1784 + iVar235 >> auVar275;
  auVar181._0_4_ = local_1788 + iVar235 >> auVar275;
  auVar181._12_4_ = iStack_177c + iVar235 >> auVar275;
  auVar181._8_4_ = iStack_1780 + iVar235 >> auVar275;
  auVar272 = packssdw(auVar182,auVar181);
  local_2a68 = auVar269._0_2_;
  uStack_2a66 = auVar269._2_2_;
  uStack_2a64 = auVar269._4_2_;
  uStack_2a62 = auVar269._6_2_;
  local_2a78 = auVar263._0_2_;
  uStack_2a76 = auVar263._2_2_;
  uStack_2a74 = auVar263._4_2_;
  uStack_2a72 = auVar263._6_2_;
  uStack_27e0 = auVar269._8_2_;
  uStack_27de = auVar269._10_2_;
  uStack_27dc = auVar269._12_2_;
  uStack_27da = auVar269._14_2_;
  uStack_27f0 = auVar263._8_2_;
  uStack_27ee = auVar263._10_2_;
  uStack_27ec = auVar263._12_2_;
  uStack_27ea = auVar263._14_2_;
  auVar60._2_2_ = local_2a78;
  auVar60._0_2_ = local_2a68;
  auVar60._4_2_ = uStack_2a66;
  auVar60._6_2_ = uStack_2a76;
  auVar60._10_2_ = uStack_2a74;
  auVar60._8_2_ = uStack_2a64;
  auVar60._12_2_ = uStack_2a62;
  auVar60._14_2_ = uStack_2a72;
  auVar59._8_8_ = CONCAT44(uVar238,uVar238);
  auVar59._0_8_ = CONCAT44(uVar238,uVar238);
  auVar263 = pmaddwd(auVar60,auVar59);
  auVar58._2_2_ = uStack_27f0;
  auVar58._0_2_ = uStack_27e0;
  auVar58._4_2_ = uStack_27de;
  auVar58._6_2_ = uStack_27ee;
  auVar58._10_2_ = uStack_27ec;
  auVar58._8_2_ = uStack_27dc;
  auVar58._12_2_ = uStack_27da;
  auVar58._14_2_ = uStack_27ea;
  auVar57._8_8_ = CONCAT44(uVar238,uVar238);
  auVar57._0_8_ = CONCAT44(uVar238,uVar238);
  auVar269 = pmaddwd(auVar58,auVar57);
  auVar56._2_2_ = local_2a78;
  auVar56._0_2_ = local_2a68;
  auVar56._4_2_ = uStack_2a66;
  auVar56._6_2_ = uStack_2a76;
  auVar56._10_2_ = uStack_2a74;
  auVar56._8_2_ = uStack_2a64;
  auVar56._12_2_ = uStack_2a62;
  auVar56._14_2_ = uStack_2a72;
  auVar55._8_8_ = uVar232;
  auVar55._0_8_ = uVar231;
  auVar273 = pmaddwd(auVar56,auVar55);
  auVar54._2_2_ = uStack_27f0;
  auVar54._0_2_ = uStack_27e0;
  auVar54._4_2_ = uStack_27de;
  auVar54._6_2_ = uStack_27ee;
  auVar54._10_2_ = uStack_27ec;
  auVar54._8_2_ = uStack_27dc;
  auVar54._12_2_ = uStack_27da;
  auVar54._14_2_ = uStack_27ea;
  auVar53._8_8_ = uVar232;
  auVar53._0_8_ = uVar231;
  auVar275 = pmaddwd(auVar54,auVar53);
  local_17a8 = auVar263._0_4_;
  iStack_17a4 = auVar263._4_4_;
  iStack_17a0 = auVar263._8_4_;
  iStack_179c = auVar263._12_4_;
  local_17c8 = auVar269._0_4_;
  iStack_17c4 = auVar269._4_4_;
  iStack_17c0 = auVar269._8_4_;
  iStack_17bc = auVar269._12_4_;
  local_17e8 = auVar273._0_4_;
  iStack_17e4 = auVar273._4_4_;
  iStack_17e0 = auVar273._8_4_;
  iStack_17dc = auVar273._12_4_;
  local_1808 = auVar275._0_4_;
  iStack_1804 = auVar275._4_4_;
  iStack_1800 = auVar275._8_4_;
  iStack_17fc = auVar275._12_4_;
  auVar263 = ZEXT416((uint)(int)in_DL);
  auVar269 = ZEXT416((uint)(int)in_DL);
  auVar273 = ZEXT416((uint)(int)in_DL);
  auVar275 = ZEXT416((uint)(int)in_DL);
  auVar180._4_4_ = iStack_17a4 + iVar235 >> auVar263;
  auVar180._0_4_ = local_17a8 + iVar235 >> auVar263;
  auVar180._12_4_ = iStack_179c + iVar235 >> auVar263;
  auVar180._8_4_ = iStack_17a0 + iVar235 >> auVar263;
  auVar179._4_4_ = iStack_17c4 + iVar235 >> auVar269;
  auVar179._0_4_ = local_17c8 + iVar235 >> auVar269;
  auVar179._12_4_ = iStack_17bc + iVar235 >> auVar269;
  auVar179._8_4_ = iStack_17c0 + iVar235 >> auVar269;
  auVar263 = packssdw(auVar180,auVar179);
  auVar178._4_4_ = iStack_17e4 + iVar235 >> auVar273;
  auVar178._0_4_ = local_17e8 + iVar235 >> auVar273;
  auVar178._12_4_ = iStack_17dc + iVar235 >> auVar273;
  auVar178._8_4_ = iStack_17e0 + iVar235 >> auVar273;
  auVar177._4_4_ = iStack_1804 + iVar235 >> auVar275;
  auVar177._0_4_ = local_1808 + iVar235 >> auVar275;
  auVar177._12_4_ = iStack_17fc + iVar235 >> auVar275;
  auVar177._8_4_ = iStack_1800 + iVar235 >> auVar275;
  auVar269 = packssdw(auVar178,auVar177);
  local_2a88 = auVar262._0_2_;
  uStack_2a86 = auVar262._2_2_;
  uStack_2a84 = auVar262._4_2_;
  uStack_2a82 = auVar262._6_2_;
  local_2a98 = auVar265._0_2_;
  uStack_2a96 = auVar265._2_2_;
  uStack_2a94 = auVar265._4_2_;
  uStack_2a92 = auVar265._6_2_;
  uStack_2800 = auVar262._8_2_;
  uStack_27fe = auVar262._10_2_;
  uStack_27fc = auVar262._12_2_;
  uStack_27fa = auVar262._14_2_;
  uStack_2810 = auVar265._8_2_;
  uStack_280e = auVar265._10_2_;
  uStack_280c = auVar265._12_2_;
  uStack_280a = auVar265._14_2_;
  auVar52._2_2_ = local_2a98;
  auVar52._0_2_ = local_2a88;
  auVar52._4_2_ = uStack_2a86;
  auVar52._6_2_ = uStack_2a96;
  auVar52._10_2_ = uStack_2a94;
  auVar52._8_2_ = uStack_2a84;
  auVar52._12_2_ = uStack_2a82;
  auVar52._14_2_ = uStack_2a92;
  auVar51._8_8_ = CONCAT44(uVar240,uVar240);
  auVar51._0_8_ = CONCAT44(uVar240,uVar240);
  auVar262 = pmaddwd(auVar52,auVar51);
  auVar50._2_2_ = uStack_2810;
  auVar50._0_2_ = uStack_2800;
  auVar50._4_2_ = uStack_27fe;
  auVar50._6_2_ = uStack_280e;
  auVar50._10_2_ = uStack_280c;
  auVar50._8_2_ = uStack_27fc;
  auVar50._12_2_ = uStack_27fa;
  auVar50._14_2_ = uStack_280a;
  auVar49._8_8_ = CONCAT44(uVar240,uVar240);
  auVar49._0_8_ = CONCAT44(uVar240,uVar240);
  auVar265 = pmaddwd(auVar50,auVar49);
  auVar48._2_2_ = local_2a98;
  auVar48._0_2_ = local_2a88;
  auVar48._4_2_ = uStack_2a86;
  auVar48._6_2_ = uStack_2a96;
  auVar48._10_2_ = uStack_2a94;
  auVar48._8_2_ = uStack_2a84;
  auVar48._12_2_ = uStack_2a82;
  auVar48._14_2_ = uStack_2a92;
  auVar47._8_8_ = uVar234;
  auVar47._0_8_ = uVar233;
  auVar273 = pmaddwd(auVar48,auVar47);
  auVar46._2_2_ = uStack_2810;
  auVar46._0_2_ = uStack_2800;
  auVar46._4_2_ = uStack_27fe;
  auVar46._6_2_ = uStack_280e;
  auVar46._10_2_ = uStack_280c;
  auVar46._8_2_ = uStack_27fc;
  auVar46._12_2_ = uStack_27fa;
  auVar46._14_2_ = uStack_280a;
  auVar45._8_8_ = uVar234;
  auVar45._0_8_ = uVar233;
  auVar275 = pmaddwd(auVar46,auVar45);
  local_1828 = auVar262._0_4_;
  iStack_1824 = auVar262._4_4_;
  iStack_1820 = auVar262._8_4_;
  iStack_181c = auVar262._12_4_;
  local_1848 = auVar265._0_4_;
  iStack_1844 = auVar265._4_4_;
  iStack_1840 = auVar265._8_4_;
  iStack_183c = auVar265._12_4_;
  local_1868 = auVar273._0_4_;
  iStack_1864 = auVar273._4_4_;
  iStack_1860 = auVar273._8_4_;
  iStack_185c = auVar273._12_4_;
  local_1888 = auVar275._0_4_;
  iStack_1884 = auVar275._4_4_;
  iStack_1880 = auVar275._8_4_;
  iStack_187c = auVar275._12_4_;
  auVar262 = ZEXT416((uint)(int)in_DL);
  auVar265 = ZEXT416((uint)(int)in_DL);
  auVar273 = ZEXT416((uint)(int)in_DL);
  auVar275 = ZEXT416((uint)(int)in_DL);
  auVar176._4_4_ = iStack_1824 + iVar235 >> auVar262;
  auVar176._0_4_ = local_1828 + iVar235 >> auVar262;
  auVar176._12_4_ = iStack_181c + iVar235 >> auVar262;
  auVar176._8_4_ = iStack_1820 + iVar235 >> auVar262;
  auVar175._4_4_ = iStack_1844 + iVar235 >> auVar265;
  auVar175._0_4_ = local_1848 + iVar235 >> auVar265;
  auVar175._12_4_ = iStack_183c + iVar235 >> auVar265;
  auVar175._8_4_ = iStack_1840 + iVar235 >> auVar265;
  auVar262 = packssdw(auVar176,auVar175);
  auVar174._4_4_ = iStack_1864 + iVar235 >> auVar273;
  auVar174._0_4_ = local_1868 + iVar235 >> auVar273;
  auVar174._12_4_ = iStack_185c + iVar235 >> auVar273;
  auVar174._8_4_ = iStack_1860 + iVar235 >> auVar273;
  auVar173._4_4_ = iStack_1884 + iVar235 >> auVar275;
  auVar173._0_4_ = local_1888 + iVar235 >> auVar275;
  auVar173._12_4_ = iStack_187c + iVar235 >> auVar275;
  auVar173._8_4_ = iStack_1880 + iVar235 >> auVar275;
  auVar265 = packssdw(auVar174,auVar173);
  auVar273 = paddsw(auVar274,auVar267);
  auVar267 = psubsw(auVar274,auVar267);
  auVar274 = paddsw(auVar270,auVar268);
  auVar268 = psubsw(auVar270,auVar268);
  auVar270 = paddsw(auVar271,auVar264);
  auVar264 = psubsw(auVar271,auVar264);
  auVar271 = paddsw(auVar260,auVar272);
  auVar260 = psubsw(auVar260,auVar272);
  auVar272 = paddsw(auVar261,auVar263);
  auVar261 = psubsw(auVar261,auVar263);
  auVar263 = paddsw(auVar266,auVar269);
  auVar266 = psubsw(auVar266,auVar269);
  auVar269 = paddsw(auVar259,auVar262);
  auVar259 = psubsw(auVar259,auVar262);
  auVar262 = paddsw(auVar258,auVar265);
  auVar258 = psubsw(auVar258,auVar265);
  local_2aa8 = auVar273._0_2_;
  uStack_2aa6 = auVar273._2_2_;
  uStack_2aa4 = auVar273._4_2_;
  uStack_2aa2 = auVar273._6_2_;
  local_2ab8 = auVar274._0_2_;
  uStack_2ab6 = auVar274._2_2_;
  uStack_2ab4 = auVar274._4_2_;
  uStack_2ab2 = auVar274._6_2_;
  uStack_2820 = auVar273._8_2_;
  uStack_281e = auVar273._10_2_;
  uStack_281c = auVar273._12_2_;
  uStack_281a = auVar273._14_2_;
  uStack_2830 = auVar274._8_2_;
  uStack_282e = auVar274._10_2_;
  uStack_282c = auVar274._12_2_;
  uStack_282a = auVar274._14_2_;
  auVar44._2_2_ = local_2ab8;
  auVar44._0_2_ = local_2aa8;
  auVar44._4_2_ = uStack_2aa6;
  auVar44._6_2_ = uStack_2ab6;
  auVar44._10_2_ = uStack_2ab4;
  auVar44._8_2_ = uStack_2aa4;
  auVar44._12_2_ = uStack_2aa2;
  auVar44._14_2_ = uStack_2ab2;
  auVar43._8_8_ = CONCAT44(uVar241,uVar241);
  auVar43._0_8_ = CONCAT44(uVar241,uVar241);
  auVar265 = pmaddwd(auVar44,auVar43);
  auVar42._2_2_ = uStack_2830;
  auVar42._0_2_ = uStack_2820;
  auVar42._4_2_ = uStack_281e;
  auVar42._6_2_ = uStack_282e;
  auVar42._10_2_ = uStack_282c;
  auVar42._8_2_ = uStack_281c;
  auVar42._12_2_ = uStack_281a;
  auVar42._14_2_ = uStack_282a;
  auVar41._8_8_ = CONCAT44(uVar241,uVar241);
  auVar41._0_8_ = CONCAT44(uVar241,uVar241);
  auVar273 = pmaddwd(auVar42,auVar41);
  auVar40._2_2_ = local_2ab8;
  auVar40._0_2_ = local_2aa8;
  auVar40._4_2_ = uStack_2aa6;
  auVar40._6_2_ = uStack_2ab6;
  auVar40._10_2_ = uStack_2ab4;
  auVar40._8_2_ = uStack_2aa4;
  auVar40._12_2_ = uStack_2aa2;
  auVar40._14_2_ = uStack_2ab2;
  auVar39._8_8_ = CONCAT44(iVar242,iVar242);
  auVar39._0_8_ = CONCAT44(iVar242,iVar242);
  auVar274 = pmaddwd(auVar40,auVar39);
  auVar277._2_2_ = uStack_2830;
  auVar277._0_2_ = uStack_2820;
  auVar277._4_2_ = uStack_281e;
  auVar277._6_2_ = uStack_282e;
  auVar277._10_2_ = uStack_282c;
  auVar277._8_2_ = uStack_281c;
  auVar277._12_2_ = uStack_281a;
  auVar277._14_2_ = uStack_282a;
  auVar276._8_8_ = CONCAT44(iVar242,iVar242);
  auVar276._0_8_ = CONCAT44(iVar242,iVar242);
  auVar275 = pmaddwd(auVar277,auVar276);
  local_18a8 = auVar265._0_4_;
  iStack_18a4 = auVar265._4_4_;
  iStack_18a0 = auVar265._8_4_;
  iStack_189c = auVar265._12_4_;
  local_18c8 = auVar273._0_4_;
  iStack_18c4 = auVar273._4_4_;
  iStack_18c0 = auVar273._8_4_;
  iStack_18bc = auVar273._12_4_;
  local_18e8 = auVar274._0_4_;
  iStack_18e4 = auVar274._4_4_;
  iStack_18e0 = auVar274._8_4_;
  iStack_18dc = auVar274._12_4_;
  local_1908 = auVar275._0_4_;
  iStack_1904 = auVar275._4_4_;
  iStack_1900 = auVar275._8_4_;
  iStack_18fc = auVar275._12_4_;
  auVar265 = ZEXT416((uint)(int)in_DL);
  auVar273 = ZEXT416((uint)(int)in_DL);
  auVar274 = ZEXT416((uint)(int)in_DL);
  auVar275 = ZEXT416((uint)(int)in_DL);
  auVar172._4_4_ = iStack_18a4 + iVar235 >> auVar265;
  auVar172._0_4_ = local_18a8 + iVar235 >> auVar265;
  auVar172._12_4_ = iStack_189c + iVar235 >> auVar265;
  auVar172._8_4_ = iStack_18a0 + iVar235 >> auVar265;
  auVar171._4_4_ = iStack_18c4 + iVar235 >> auVar273;
  auVar171._0_4_ = local_18c8 + iVar235 >> auVar273;
  auVar171._12_4_ = iStack_18bc + iVar235 >> auVar273;
  auVar171._8_4_ = iStack_18c0 + iVar235 >> auVar273;
  auVar276 = packssdw(auVar172,auVar171);
  auVar170._4_4_ = iStack_18e4 + iVar235 >> auVar274;
  auVar170._0_4_ = local_18e8 + iVar235 >> auVar274;
  auVar170._12_4_ = iStack_18dc + iVar235 >> auVar274;
  auVar170._8_4_ = iStack_18e0 + iVar235 >> auVar274;
  auVar169._4_4_ = iStack_1904 + iVar235 >> auVar275;
  auVar169._0_4_ = local_1908 + iVar235 >> auVar275;
  auVar169._12_4_ = iStack_18fc + iVar235 >> auVar275;
  auVar169._8_4_ = iStack_1900 + iVar235 >> auVar275;
  auVar277 = packssdw(auVar170,auVar169);
  local_2ac8 = auVar270._0_2_;
  uStack_2ac6 = auVar270._2_2_;
  uStack_2ac4 = auVar270._4_2_;
  uStack_2ac2 = auVar270._6_2_;
  local_2ad8 = auVar271._0_2_;
  uStack_2ad6 = auVar271._2_2_;
  uStack_2ad4 = auVar271._4_2_;
  uStack_2ad2 = auVar271._6_2_;
  uStack_2840 = auVar270._8_2_;
  uStack_283e = auVar270._10_2_;
  uStack_283c = auVar270._12_2_;
  uStack_283a = auVar270._14_2_;
  uStack_2850 = auVar271._8_2_;
  uStack_284e = auVar271._10_2_;
  uStack_284c = auVar271._12_2_;
  uStack_284a = auVar271._14_2_;
  auVar38._2_2_ = local_2ad8;
  auVar38._0_2_ = local_2ac8;
  auVar38._4_2_ = uStack_2ac6;
  auVar38._6_2_ = uStack_2ad6;
  auVar38._10_2_ = uStack_2ad4;
  auVar38._8_2_ = uStack_2ac4;
  auVar38._12_2_ = uStack_2ac2;
  auVar38._14_2_ = uStack_2ad2;
  auVar37._8_8_ = CONCAT44(uVar243,uVar243);
  auVar37._0_8_ = CONCAT44(uVar243,uVar243);
  auVar265 = pmaddwd(auVar38,auVar37);
  auVar36._2_2_ = uStack_2850;
  auVar36._0_2_ = uStack_2840;
  auVar36._4_2_ = uStack_283e;
  auVar36._6_2_ = uStack_284e;
  auVar36._10_2_ = uStack_284c;
  auVar36._8_2_ = uStack_283c;
  auVar36._12_2_ = uStack_283a;
  auVar36._14_2_ = uStack_284a;
  auVar35._8_8_ = CONCAT44(uVar243,uVar243);
  auVar35._0_8_ = CONCAT44(uVar243,uVar243);
  auVar270 = pmaddwd(auVar36,auVar35);
  auVar34._2_2_ = local_2ad8;
  auVar34._0_2_ = local_2ac8;
  auVar34._4_2_ = uStack_2ac6;
  auVar34._6_2_ = uStack_2ad6;
  auVar34._10_2_ = uStack_2ad4;
  auVar34._8_2_ = uStack_2ac4;
  auVar34._12_2_ = uStack_2ac2;
  auVar34._14_2_ = uStack_2ad2;
  auVar33._8_8_ = CONCAT44(iVar244,iVar244);
  auVar33._0_8_ = CONCAT44(iVar244,iVar244);
  auVar271 = pmaddwd(auVar34,auVar33);
  auVar279._2_2_ = uStack_2850;
  auVar279._0_2_ = uStack_2840;
  auVar279._4_2_ = uStack_283e;
  auVar279._6_2_ = uStack_284e;
  auVar279._10_2_ = uStack_284c;
  auVar279._8_2_ = uStack_283c;
  auVar279._12_2_ = uStack_283a;
  auVar279._14_2_ = uStack_284a;
  auVar278._8_8_ = CONCAT44(iVar244,iVar244);
  auVar278._0_8_ = CONCAT44(iVar244,iVar244);
  auVar273 = pmaddwd(auVar279,auVar278);
  local_1928 = auVar265._0_4_;
  iStack_1924 = auVar265._4_4_;
  iStack_1920 = auVar265._8_4_;
  iStack_191c = auVar265._12_4_;
  local_1948 = auVar270._0_4_;
  iStack_1944 = auVar270._4_4_;
  iStack_1940 = auVar270._8_4_;
  iStack_193c = auVar270._12_4_;
  local_1968 = auVar271._0_4_;
  iStack_1964 = auVar271._4_4_;
  iStack_1960 = auVar271._8_4_;
  iStack_195c = auVar271._12_4_;
  local_1988 = auVar273._0_4_;
  iStack_1984 = auVar273._4_4_;
  iStack_1980 = auVar273._8_4_;
  iStack_197c = auVar273._12_4_;
  auVar265 = ZEXT416((uint)(int)in_DL);
  auVar270 = ZEXT416((uint)(int)in_DL);
  auVar271 = ZEXT416((uint)(int)in_DL);
  auVar273 = ZEXT416((uint)(int)in_DL);
  auVar168._4_4_ = iStack_1924 + iVar235 >> auVar265;
  auVar168._0_4_ = local_1928 + iVar235 >> auVar265;
  auVar168._12_4_ = iStack_191c + iVar235 >> auVar265;
  auVar168._8_4_ = iStack_1920 + iVar235 >> auVar265;
  auVar167._4_4_ = iStack_1944 + iVar235 >> auVar270;
  auVar167._0_4_ = local_1948 + iVar235 >> auVar270;
  auVar167._12_4_ = iStack_193c + iVar235 >> auVar270;
  auVar167._8_4_ = iStack_1940 + iVar235 >> auVar270;
  auVar278 = packssdw(auVar168,auVar167);
  auVar166._4_4_ = iStack_1964 + iVar235 >> auVar271;
  auVar166._0_4_ = local_1968 + iVar235 >> auVar271;
  auVar166._12_4_ = iStack_195c + iVar235 >> auVar271;
  auVar166._8_4_ = iStack_1960 + iVar235 >> auVar271;
  auVar165._4_4_ = iStack_1984 + iVar235 >> auVar273;
  auVar165._0_4_ = local_1988 + iVar235 >> auVar273;
  auVar165._12_4_ = iStack_197c + iVar235 >> auVar273;
  auVar165._8_4_ = iStack_1980 + iVar235 >> auVar273;
  auVar279 = packssdw(auVar166,auVar165);
  local_2ae8 = auVar272._0_2_;
  uStack_2ae6 = auVar272._2_2_;
  uStack_2ae4 = auVar272._4_2_;
  uStack_2ae2 = auVar272._6_2_;
  local_2af8 = auVar263._0_2_;
  uStack_2af6 = auVar263._2_2_;
  uStack_2af4 = auVar263._4_2_;
  uStack_2af2 = auVar263._6_2_;
  uStack_2860 = auVar272._8_2_;
  uStack_285e = auVar272._10_2_;
  uStack_285c = auVar272._12_2_;
  uStack_285a = auVar272._14_2_;
  uStack_2870 = auVar263._8_2_;
  uStack_286e = auVar263._10_2_;
  uStack_286c = auVar263._12_2_;
  uStack_286a = auVar263._14_2_;
  auVar32._2_2_ = local_2af8;
  auVar32._0_2_ = local_2ae8;
  auVar32._4_2_ = uStack_2ae6;
  auVar32._6_2_ = uStack_2af6;
  auVar32._10_2_ = uStack_2af4;
  auVar32._8_2_ = uStack_2ae4;
  auVar32._12_2_ = uStack_2ae2;
  auVar32._14_2_ = uStack_2af2;
  auVar31._8_8_ = CONCAT44(uVar245,uVar245);
  auVar31._0_8_ = CONCAT44(uVar245,uVar245);
  auVar263 = pmaddwd(auVar32,auVar31);
  auVar30._2_2_ = uStack_2870;
  auVar30._0_2_ = uStack_2860;
  auVar30._4_2_ = uStack_285e;
  auVar30._6_2_ = uStack_286e;
  auVar30._10_2_ = uStack_286c;
  auVar30._8_2_ = uStack_285c;
  auVar30._12_2_ = uStack_285a;
  auVar30._14_2_ = uStack_286a;
  auVar29._8_8_ = CONCAT44(uVar245,uVar245);
  auVar29._0_8_ = CONCAT44(uVar245,uVar245);
  auVar265 = pmaddwd(auVar30,auVar29);
  auVar28._2_2_ = local_2af8;
  auVar28._0_2_ = local_2ae8;
  auVar28._4_2_ = uStack_2ae6;
  auVar28._6_2_ = uStack_2af6;
  auVar28._10_2_ = uStack_2af4;
  auVar28._8_2_ = uStack_2ae4;
  auVar28._12_2_ = uStack_2ae2;
  auVar28._14_2_ = uStack_2af2;
  auVar27._8_8_ = CONCAT44(iVar246,iVar246);
  auVar27._0_8_ = CONCAT44(iVar246,iVar246);
  auVar270 = pmaddwd(auVar28,auVar27);
  auVar281._2_2_ = uStack_2870;
  auVar281._0_2_ = uStack_2860;
  auVar281._4_2_ = uStack_285e;
  auVar281._6_2_ = uStack_286e;
  auVar281._10_2_ = uStack_286c;
  auVar281._8_2_ = uStack_285c;
  auVar281._12_2_ = uStack_285a;
  auVar281._14_2_ = uStack_286a;
  auVar280._8_8_ = CONCAT44(iVar246,iVar246);
  auVar280._0_8_ = CONCAT44(iVar246,iVar246);
  auVar271 = pmaddwd(auVar281,auVar280);
  local_19a8 = auVar263._0_4_;
  iStack_19a4 = auVar263._4_4_;
  iStack_19a0 = auVar263._8_4_;
  iStack_199c = auVar263._12_4_;
  local_19c8 = auVar265._0_4_;
  iStack_19c4 = auVar265._4_4_;
  iStack_19c0 = auVar265._8_4_;
  iStack_19bc = auVar265._12_4_;
  local_19e8 = auVar270._0_4_;
  iStack_19e4 = auVar270._4_4_;
  iStack_19e0 = auVar270._8_4_;
  iStack_19dc = auVar270._12_4_;
  local_1a08 = auVar271._0_4_;
  iStack_1a04 = auVar271._4_4_;
  iStack_1a00 = auVar271._8_4_;
  iStack_19fc = auVar271._12_4_;
  auVar263 = ZEXT416((uint)(int)in_DL);
  auVar265 = ZEXT416((uint)(int)in_DL);
  auVar270 = ZEXT416((uint)(int)in_DL);
  auVar271 = ZEXT416((uint)(int)in_DL);
  auVar164._4_4_ = iStack_19a4 + iVar235 >> auVar263;
  auVar164._0_4_ = local_19a8 + iVar235 >> auVar263;
  auVar164._12_4_ = iStack_199c + iVar235 >> auVar263;
  auVar164._8_4_ = iStack_19a0 + iVar235 >> auVar263;
  auVar163._4_4_ = iStack_19c4 + iVar235 >> auVar265;
  auVar163._0_4_ = local_19c8 + iVar235 >> auVar265;
  auVar163._12_4_ = iStack_19bc + iVar235 >> auVar265;
  auVar163._8_4_ = iStack_19c0 + iVar235 >> auVar265;
  auVar280 = packssdw(auVar164,auVar163);
  auVar162._4_4_ = iStack_19e4 + iVar235 >> auVar270;
  auVar162._0_4_ = local_19e8 + iVar235 >> auVar270;
  auVar162._12_4_ = iStack_19dc + iVar235 >> auVar270;
  auVar162._8_4_ = iStack_19e0 + iVar235 >> auVar270;
  auVar161._4_4_ = iStack_1a04 + iVar235 >> auVar271;
  auVar161._0_4_ = local_1a08 + iVar235 >> auVar271;
  auVar161._12_4_ = iStack_19fc + iVar235 >> auVar271;
  auVar161._8_4_ = iStack_1a00 + iVar235 >> auVar271;
  auVar281 = packssdw(auVar162,auVar161);
  local_2b08 = auVar269._0_2_;
  uStack_2b06 = auVar269._2_2_;
  uStack_2b04 = auVar269._4_2_;
  uStack_2b02 = auVar269._6_2_;
  local_2b18 = auVar262._0_2_;
  uStack_2b16 = auVar262._2_2_;
  uStack_2b14 = auVar262._4_2_;
  uStack_2b12 = auVar262._6_2_;
  uStack_2880 = auVar269._8_2_;
  uStack_287e = auVar269._10_2_;
  uStack_287c = auVar269._12_2_;
  uStack_287a = auVar269._14_2_;
  uStack_2890 = auVar262._8_2_;
  uStack_288e = auVar262._10_2_;
  uStack_288c = auVar262._12_2_;
  uStack_288a = auVar262._14_2_;
  auVar26._2_2_ = local_2b18;
  auVar26._0_2_ = local_2b08;
  auVar26._4_2_ = uStack_2b06;
  auVar26._6_2_ = uStack_2b16;
  auVar26._10_2_ = uStack_2b14;
  auVar26._8_2_ = uStack_2b04;
  auVar26._12_2_ = uStack_2b02;
  auVar26._14_2_ = uStack_2b12;
  auVar25._8_8_ = CONCAT44(uVar247,uVar247);
  auVar25._0_8_ = CONCAT44(uVar247,uVar247);
  auVar262 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = uStack_2890;
  auVar24._0_2_ = uStack_2880;
  auVar24._4_2_ = uStack_287e;
  auVar24._6_2_ = uStack_288e;
  auVar24._10_2_ = uStack_288c;
  auVar24._8_2_ = uStack_287c;
  auVar24._12_2_ = uStack_287a;
  auVar24._14_2_ = uStack_288a;
  auVar23._8_8_ = CONCAT44(uVar247,uVar247);
  auVar23._0_8_ = CONCAT44(uVar247,uVar247);
  auVar263 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = local_2b18;
  auVar22._0_2_ = local_2b08;
  auVar22._4_2_ = uStack_2b06;
  auVar22._6_2_ = uStack_2b16;
  auVar22._10_2_ = uStack_2b14;
  auVar22._8_2_ = uStack_2b04;
  auVar22._12_2_ = uStack_2b02;
  auVar22._14_2_ = uStack_2b12;
  auVar21._8_8_ = CONCAT44(iVar248,iVar248);
  auVar21._0_8_ = CONCAT44(iVar248,iVar248);
  auVar265 = pmaddwd(auVar22,auVar21);
  auVar283._2_2_ = uStack_2890;
  auVar283._0_2_ = uStack_2880;
  auVar283._4_2_ = uStack_287e;
  auVar283._6_2_ = uStack_288e;
  auVar283._10_2_ = uStack_288c;
  auVar283._8_2_ = uStack_287c;
  auVar283._12_2_ = uStack_287a;
  auVar283._14_2_ = uStack_288a;
  auVar282._8_8_ = CONCAT44(iVar248,iVar248);
  auVar282._0_8_ = CONCAT44(iVar248,iVar248);
  auVar269 = pmaddwd(auVar283,auVar282);
  local_1a28 = auVar262._0_4_;
  iStack_1a24 = auVar262._4_4_;
  iStack_1a20 = auVar262._8_4_;
  iStack_1a1c = auVar262._12_4_;
  local_1a48 = auVar263._0_4_;
  iStack_1a44 = auVar263._4_4_;
  iStack_1a40 = auVar263._8_4_;
  iStack_1a3c = auVar263._12_4_;
  local_1a68 = auVar265._0_4_;
  iStack_1a64 = auVar265._4_4_;
  iStack_1a60 = auVar265._8_4_;
  iStack_1a5c = auVar265._12_4_;
  local_1a88 = auVar269._0_4_;
  iStack_1a84 = auVar269._4_4_;
  iStack_1a80 = auVar269._8_4_;
  iStack_1a7c = auVar269._12_4_;
  auVar262 = ZEXT416((uint)(int)in_DL);
  auVar263 = ZEXT416((uint)(int)in_DL);
  auVar265 = ZEXT416((uint)(int)in_DL);
  auVar269 = ZEXT416((uint)(int)in_DL);
  auVar160._4_4_ = iStack_1a24 + iVar235 >> auVar262;
  auVar160._0_4_ = local_1a28 + iVar235 >> auVar262;
  auVar160._12_4_ = iStack_1a1c + iVar235 >> auVar262;
  auVar160._8_4_ = iStack_1a20 + iVar235 >> auVar262;
  auVar159._4_4_ = iStack_1a44 + iVar235 >> auVar263;
  auVar159._0_4_ = local_1a48 + iVar235 >> auVar263;
  auVar159._12_4_ = iStack_1a3c + iVar235 >> auVar263;
  auVar159._8_4_ = iStack_1a40 + iVar235 >> auVar263;
  auVar282 = packssdw(auVar160,auVar159);
  auVar158._4_4_ = iStack_1a64 + iVar235 >> auVar265;
  auVar158._0_4_ = local_1a68 + iVar235 >> auVar265;
  auVar158._12_4_ = iStack_1a5c + iVar235 >> auVar265;
  auVar158._8_4_ = iStack_1a60 + iVar235 >> auVar265;
  auVar157._4_4_ = iStack_1a84 + iVar235 >> auVar269;
  auVar157._0_4_ = local_1a88 + iVar235 >> auVar269;
  auVar157._12_4_ = iStack_1a7c + iVar235 >> auVar269;
  auVar157._8_4_ = iStack_1a80 + iVar235 >> auVar269;
  auVar283 = packssdw(auVar158,auVar157);
  local_2b28 = auVar267._0_2_;
  uStack_2b26 = auVar267._2_2_;
  uStack_2b24 = auVar267._4_2_;
  uStack_2b22 = auVar267._6_2_;
  local_2b38 = auVar268._0_2_;
  uStack_2b36 = auVar268._2_2_;
  uStack_2b34 = auVar268._4_2_;
  uStack_2b32 = auVar268._6_2_;
  uStack_28a0 = auVar267._8_2_;
  uStack_289e = auVar267._10_2_;
  uStack_289c = auVar267._12_2_;
  uStack_289a = auVar267._14_2_;
  uStack_28b0 = auVar268._8_2_;
  uStack_28ae = auVar268._10_2_;
  uStack_28ac = auVar268._12_2_;
  uStack_28aa = auVar268._14_2_;
  auVar20._2_2_ = local_2b38;
  auVar20._0_2_ = local_2b28;
  auVar20._4_2_ = uStack_2b26;
  auVar20._6_2_ = uStack_2b36;
  auVar20._10_2_ = uStack_2b34;
  auVar20._8_2_ = uStack_2b24;
  auVar20._12_2_ = uStack_2b22;
  auVar20._14_2_ = uStack_2b32;
  auVar19._8_8_ = CONCAT44(uVar249,uVar249);
  auVar19._0_8_ = CONCAT44(uVar249,uVar249);
  auVar262 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = uStack_28b0;
  auVar18._0_2_ = uStack_28a0;
  auVar18._4_2_ = uStack_289e;
  auVar18._6_2_ = uStack_28ae;
  auVar18._10_2_ = uStack_28ac;
  auVar18._8_2_ = uStack_289c;
  auVar18._12_2_ = uStack_289a;
  auVar18._14_2_ = uStack_28aa;
  auVar17._8_8_ = CONCAT44(uVar249,uVar249);
  auVar17._0_8_ = CONCAT44(uVar249,uVar249);
  auVar263 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = local_2b38;
  auVar16._0_2_ = local_2b28;
  auVar16._4_2_ = uStack_2b26;
  auVar16._6_2_ = uStack_2b36;
  auVar16._10_2_ = uStack_2b34;
  auVar16._8_2_ = uStack_2b24;
  auVar16._12_2_ = uStack_2b22;
  auVar16._14_2_ = uStack_2b32;
  auVar15._8_8_ = CONCAT44(iVar250,iVar250);
  auVar15._0_8_ = CONCAT44(iVar250,iVar250);
  auVar265 = pmaddwd(auVar16,auVar15);
  auVar285._2_2_ = uStack_28b0;
  auVar285._0_2_ = uStack_28a0;
  auVar285._4_2_ = uStack_289e;
  auVar285._6_2_ = uStack_28ae;
  auVar285._10_2_ = uStack_28ac;
  auVar285._8_2_ = uStack_289c;
  auVar285._12_2_ = uStack_289a;
  auVar285._14_2_ = uStack_28aa;
  auVar284._8_8_ = CONCAT44(iVar250,iVar250);
  auVar284._0_8_ = CONCAT44(iVar250,iVar250);
  auVar267 = pmaddwd(auVar285,auVar284);
  local_1aa8 = auVar262._0_4_;
  iStack_1aa4 = auVar262._4_4_;
  iStack_1aa0 = auVar262._8_4_;
  iStack_1a9c = auVar262._12_4_;
  local_1ac8 = auVar263._0_4_;
  iStack_1ac4 = auVar263._4_4_;
  iStack_1ac0 = auVar263._8_4_;
  iStack_1abc = auVar263._12_4_;
  local_1ae8 = auVar265._0_4_;
  iStack_1ae4 = auVar265._4_4_;
  iStack_1ae0 = auVar265._8_4_;
  iStack_1adc = auVar265._12_4_;
  local_1b08 = auVar267._0_4_;
  iStack_1b04 = auVar267._4_4_;
  iStack_1b00 = auVar267._8_4_;
  iStack_1afc = auVar267._12_4_;
  auVar262 = ZEXT416((uint)(int)in_DL);
  auVar263 = ZEXT416((uint)(int)in_DL);
  auVar265 = ZEXT416((uint)(int)in_DL);
  auVar267 = ZEXT416((uint)(int)in_DL);
  auVar156._4_4_ = iStack_1aa4 + iVar235 >> auVar262;
  auVar156._0_4_ = local_1aa8 + iVar235 >> auVar262;
  auVar156._12_4_ = iStack_1a9c + iVar235 >> auVar262;
  auVar156._8_4_ = iStack_1aa0 + iVar235 >> auVar262;
  auVar155._4_4_ = iStack_1ac4 + iVar235 >> auVar263;
  auVar155._0_4_ = local_1ac8 + iVar235 >> auVar263;
  auVar155._12_4_ = iStack_1abc + iVar235 >> auVar263;
  auVar155._8_4_ = iStack_1ac0 + iVar235 >> auVar263;
  auVar284 = packssdw(auVar156,auVar155);
  auVar154._4_4_ = iStack_1ae4 + iVar235 >> auVar265;
  auVar154._0_4_ = local_1ae8 + iVar235 >> auVar265;
  auVar154._12_4_ = iStack_1adc + iVar235 >> auVar265;
  auVar154._8_4_ = iStack_1ae0 + iVar235 >> auVar265;
  auVar153._4_4_ = iStack_1b04 + iVar235 >> auVar267;
  auVar153._0_4_ = local_1b08 + iVar235 >> auVar267;
  auVar153._12_4_ = iStack_1afc + iVar235 >> auVar267;
  auVar153._8_4_ = iStack_1b00 + iVar235 >> auVar267;
  auVar285 = packssdw(auVar154,auVar153);
  local_2b48 = auVar264._0_2_;
  uStack_2b46 = auVar264._2_2_;
  uStack_2b44 = auVar264._4_2_;
  uStack_2b42 = auVar264._6_2_;
  local_2b58 = auVar260._0_2_;
  uStack_2b56 = auVar260._2_2_;
  uStack_2b54 = auVar260._4_2_;
  uStack_2b52 = auVar260._6_2_;
  uStack_28c0 = auVar264._8_2_;
  uStack_28be = auVar264._10_2_;
  uStack_28bc = auVar264._12_2_;
  uStack_28ba = auVar264._14_2_;
  uStack_28d0 = auVar260._8_2_;
  uStack_28ce = auVar260._10_2_;
  uStack_28cc = auVar260._12_2_;
  uStack_28ca = auVar260._14_2_;
  auVar14._2_2_ = local_2b58;
  auVar14._0_2_ = local_2b48;
  auVar14._4_2_ = uStack_2b46;
  auVar14._6_2_ = uStack_2b56;
  auVar14._10_2_ = uStack_2b54;
  auVar14._8_2_ = uStack_2b44;
  auVar14._12_2_ = uStack_2b42;
  auVar14._14_2_ = uStack_2b52;
  auVar13._8_8_ = CONCAT44(uVar251,uVar251);
  auVar13._0_8_ = CONCAT44(uVar251,uVar251);
  auVar260 = pmaddwd(auVar14,auVar13);
  auVar12._2_2_ = uStack_28d0;
  auVar12._0_2_ = uStack_28c0;
  auVar12._4_2_ = uStack_28be;
  auVar12._6_2_ = uStack_28ce;
  auVar12._10_2_ = uStack_28cc;
  auVar12._8_2_ = uStack_28bc;
  auVar12._12_2_ = uStack_28ba;
  auVar12._14_2_ = uStack_28ca;
  auVar11._8_8_ = CONCAT44(uVar251,uVar251);
  auVar11._0_8_ = CONCAT44(uVar251,uVar251);
  auVar262 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = local_2b58;
  auVar10._0_2_ = local_2b48;
  auVar10._4_2_ = uStack_2b46;
  auVar10._6_2_ = uStack_2b56;
  auVar10._10_2_ = uStack_2b54;
  auVar10._8_2_ = uStack_2b44;
  auVar10._12_2_ = uStack_2b42;
  auVar10._14_2_ = uStack_2b52;
  auVar9._8_8_ = CONCAT44(iVar252,iVar252);
  auVar9._0_8_ = CONCAT44(iVar252,iVar252);
  auVar263 = pmaddwd(auVar10,auVar9);
  auVar275._2_2_ = uStack_28d0;
  auVar275._0_2_ = uStack_28c0;
  auVar275._4_2_ = uStack_28be;
  auVar275._6_2_ = uStack_28ce;
  auVar275._10_2_ = uStack_28cc;
  auVar275._8_2_ = uStack_28bc;
  auVar275._12_2_ = uStack_28ba;
  auVar275._14_2_ = uStack_28ca;
  auVar274._8_8_ = CONCAT44(iVar252,iVar252);
  auVar274._0_8_ = CONCAT44(iVar252,iVar252);
  auVar264 = pmaddwd(auVar275,auVar274);
  local_1b28 = auVar260._0_4_;
  iStack_1b24 = auVar260._4_4_;
  iStack_1b20 = auVar260._8_4_;
  iStack_1b1c = auVar260._12_4_;
  local_1b48 = auVar262._0_4_;
  iStack_1b44 = auVar262._4_4_;
  iStack_1b40 = auVar262._8_4_;
  iStack_1b3c = auVar262._12_4_;
  local_1b68 = auVar263._0_4_;
  iStack_1b64 = auVar263._4_4_;
  iStack_1b60 = auVar263._8_4_;
  iStack_1b5c = auVar263._12_4_;
  local_1b88 = auVar264._0_4_;
  iStack_1b84 = auVar264._4_4_;
  iStack_1b80 = auVar264._8_4_;
  iStack_1b7c = auVar264._12_4_;
  auVar260 = ZEXT416((uint)(int)in_DL);
  auVar262 = ZEXT416((uint)(int)in_DL);
  auVar263 = ZEXT416((uint)(int)in_DL);
  auVar264 = ZEXT416((uint)(int)in_DL);
  auVar152._4_4_ = iStack_1b24 + iVar235 >> auVar260;
  auVar152._0_4_ = local_1b28 + iVar235 >> auVar260;
  auVar152._12_4_ = iStack_1b1c + iVar235 >> auVar260;
  auVar152._8_4_ = iStack_1b20 + iVar235 >> auVar260;
  auVar151._4_4_ = iStack_1b44 + iVar235 >> auVar262;
  auVar151._0_4_ = local_1b48 + iVar235 >> auVar262;
  auVar151._12_4_ = iStack_1b3c + iVar235 >> auVar262;
  auVar151._8_4_ = iStack_1b40 + iVar235 >> auVar262;
  auVar274 = packssdw(auVar152,auVar151);
  auVar150._4_4_ = iStack_1b64 + iVar235 >> auVar263;
  auVar150._0_4_ = local_1b68 + iVar235 >> auVar263;
  auVar150._12_4_ = iStack_1b5c + iVar235 >> auVar263;
  auVar150._8_4_ = iStack_1b60 + iVar235 >> auVar263;
  auVar149._4_4_ = iStack_1b84 + iVar235 >> auVar264;
  auVar149._0_4_ = local_1b88 + iVar235 >> auVar264;
  auVar149._12_4_ = iStack_1b7c + iVar235 >> auVar264;
  auVar149._8_4_ = iStack_1b80 + iVar235 >> auVar264;
  auVar275 = packssdw(auVar150,auVar149);
  local_2b68 = auVar261._0_2_;
  uStack_2b66 = auVar261._2_2_;
  uStack_2b64 = auVar261._4_2_;
  uStack_2b62 = auVar261._6_2_;
  local_2b78 = auVar266._0_2_;
  uStack_2b76 = auVar266._2_2_;
  uStack_2b74 = auVar266._4_2_;
  uStack_2b72 = auVar266._6_2_;
  uStack_28e0 = auVar261._8_2_;
  uStack_28de = auVar261._10_2_;
  uStack_28dc = auVar261._12_2_;
  uStack_28da = auVar261._14_2_;
  uStack_28f0 = auVar266._8_2_;
  uStack_28ee = auVar266._10_2_;
  uStack_28ec = auVar266._12_2_;
  uStack_28ea = auVar266._14_2_;
  auVar273._2_2_ = local_2b78;
  auVar273._0_2_ = local_2b68;
  auVar273._4_2_ = uStack_2b66;
  auVar273._6_2_ = uStack_2b76;
  auVar273._10_2_ = uStack_2b74;
  auVar273._8_2_ = uStack_2b64;
  auVar273._12_2_ = uStack_2b62;
  auVar273._14_2_ = uStack_2b72;
  auVar272._8_8_ = CONCAT44(uVar253,uVar253);
  auVar272._0_8_ = CONCAT44(uVar253,uVar253);
  auVar260 = pmaddwd(auVar273,auVar272);
  auVar271._2_2_ = uStack_28f0;
  auVar271._0_2_ = uStack_28e0;
  auVar271._4_2_ = uStack_28de;
  auVar271._6_2_ = uStack_28ee;
  auVar271._10_2_ = uStack_28ec;
  auVar271._8_2_ = uStack_28dc;
  auVar271._12_2_ = uStack_28da;
  auVar271._14_2_ = uStack_28ea;
  auVar270._8_8_ = CONCAT44(uVar253,uVar253);
  auVar270._0_8_ = CONCAT44(uVar253,uVar253);
  auVar261 = pmaddwd(auVar271,auVar270);
  auVar269._2_2_ = local_2b78;
  auVar269._0_2_ = local_2b68;
  auVar269._4_2_ = uStack_2b66;
  auVar269._6_2_ = uStack_2b76;
  auVar269._10_2_ = uStack_2b74;
  auVar269._8_2_ = uStack_2b64;
  auVar269._12_2_ = uStack_2b62;
  auVar269._14_2_ = uStack_2b72;
  auVar268._8_8_ = CONCAT44(iVar254,iVar254);
  auVar268._0_8_ = CONCAT44(iVar254,iVar254);
  auVar262 = pmaddwd(auVar269,auVar268);
  auVar267._2_2_ = uStack_28f0;
  auVar267._0_2_ = uStack_28e0;
  auVar267._4_2_ = uStack_28de;
  auVar267._6_2_ = uStack_28ee;
  auVar267._10_2_ = uStack_28ec;
  auVar267._8_2_ = uStack_28dc;
  auVar267._12_2_ = uStack_28da;
  auVar267._14_2_ = uStack_28ea;
  auVar266._8_8_ = CONCAT44(iVar254,iVar254);
  auVar266._0_8_ = CONCAT44(iVar254,iVar254);
  auVar263 = pmaddwd(auVar267,auVar266);
  local_1ba8 = auVar260._0_4_;
  iStack_1ba4 = auVar260._4_4_;
  iStack_1ba0 = auVar260._8_4_;
  iStack_1b9c = auVar260._12_4_;
  local_1bc8 = auVar261._0_4_;
  iStack_1bc4 = auVar261._4_4_;
  iStack_1bc0 = auVar261._8_4_;
  iStack_1bbc = auVar261._12_4_;
  local_1be8 = auVar262._0_4_;
  iStack_1be4 = auVar262._4_4_;
  iStack_1be0 = auVar262._8_4_;
  iStack_1bdc = auVar262._12_4_;
  local_1c08 = auVar263._0_4_;
  iStack_1c04 = auVar263._4_4_;
  iStack_1c00 = auVar263._8_4_;
  iStack_1bfc = auVar263._12_4_;
  auVar260 = ZEXT416((uint)(int)in_DL);
  auVar261 = ZEXT416((uint)(int)in_DL);
  auVar262 = ZEXT416((uint)(int)in_DL);
  auVar263 = ZEXT416((uint)(int)in_DL);
  auVar148._4_4_ = iStack_1ba4 + iVar235 >> auVar260;
  auVar148._0_4_ = local_1ba8 + iVar235 >> auVar260;
  auVar148._12_4_ = iStack_1b9c + iVar235 >> auVar260;
  auVar148._8_4_ = iStack_1ba0 + iVar235 >> auVar260;
  auVar147._4_4_ = iStack_1bc4 + iVar235 >> auVar261;
  auVar147._0_4_ = local_1bc8 + iVar235 >> auVar261;
  auVar147._12_4_ = iStack_1bbc + iVar235 >> auVar261;
  auVar147._8_4_ = iStack_1bc0 + iVar235 >> auVar261;
  auVar266 = packssdw(auVar148,auVar147);
  auVar146._4_4_ = iStack_1be4 + iVar235 >> auVar262;
  auVar146._0_4_ = local_1be8 + iVar235 >> auVar262;
  auVar146._12_4_ = iStack_1bdc + iVar235 >> auVar262;
  auVar146._8_4_ = iStack_1be0 + iVar235 >> auVar262;
  auVar145._4_4_ = iStack_1c04 + iVar235 >> auVar263;
  auVar145._0_4_ = local_1c08 + iVar235 >> auVar263;
  auVar145._12_4_ = iStack_1bfc + iVar235 >> auVar263;
  auVar145._8_4_ = iStack_1c00 + iVar235 >> auVar263;
  auVar267 = packssdw(auVar146,auVar145);
  local_2b88 = auVar259._0_2_;
  uStack_2b86 = auVar259._2_2_;
  uStack_2b84 = auVar259._4_2_;
  uStack_2b82 = auVar259._6_2_;
  local_2b98 = auVar258._0_2_;
  uStack_2b96 = auVar258._2_2_;
  uStack_2b94 = auVar258._4_2_;
  uStack_2b92 = auVar258._6_2_;
  uStack_2900 = auVar259._8_2_;
  uStack_28fe = auVar259._10_2_;
  uStack_28fc = auVar259._12_2_;
  uStack_28fa = auVar259._14_2_;
  uStack_2910 = auVar258._8_2_;
  uStack_290e = auVar258._10_2_;
  uStack_290c = auVar258._12_2_;
  uStack_290a = auVar258._14_2_;
  auVar265._2_2_ = local_2b98;
  auVar265._0_2_ = local_2b88;
  auVar265._4_2_ = uStack_2b86;
  auVar265._6_2_ = uStack_2b96;
  auVar265._10_2_ = uStack_2b94;
  auVar265._8_2_ = uStack_2b84;
  auVar265._12_2_ = uStack_2b82;
  auVar265._14_2_ = uStack_2b92;
  auVar264._8_8_ = CONCAT44(uVar255,uVar255);
  auVar264._0_8_ = CONCAT44(uVar255,uVar255);
  auVar264 = pmaddwd(auVar265,auVar264);
  auVar263._2_2_ = uStack_2910;
  auVar263._0_2_ = uStack_2900;
  auVar263._4_2_ = uStack_28fe;
  auVar263._6_2_ = uStack_290e;
  auVar263._10_2_ = uStack_290c;
  auVar263._8_2_ = uStack_28fc;
  auVar263._12_2_ = uStack_28fa;
  auVar263._14_2_ = uStack_290a;
  auVar262._8_8_ = CONCAT44(uVar255,uVar255);
  auVar262._0_8_ = CONCAT44(uVar255,uVar255);
  auVar262 = pmaddwd(auVar263,auVar262);
  auVar261._2_2_ = local_2b98;
  auVar261._0_2_ = local_2b88;
  auVar261._4_2_ = uStack_2b86;
  auVar261._6_2_ = uStack_2b96;
  auVar261._10_2_ = uStack_2b94;
  auVar261._8_2_ = uStack_2b84;
  auVar261._12_2_ = uStack_2b82;
  auVar261._14_2_ = uStack_2b92;
  auVar260._8_8_ = CONCAT44(iVar256,iVar256);
  auVar260._0_8_ = CONCAT44(iVar256,iVar256);
  auVar260 = pmaddwd(auVar261,auVar260);
  auVar259._2_2_ = uStack_2910;
  auVar259._0_2_ = uStack_2900;
  auVar259._4_2_ = uStack_28fe;
  auVar259._6_2_ = uStack_290e;
  auVar259._10_2_ = uStack_290c;
  auVar259._8_2_ = uStack_28fc;
  auVar259._12_2_ = uStack_28fa;
  auVar259._14_2_ = uStack_290a;
  auVar258._8_8_ = CONCAT44(iVar256,iVar256);
  auVar258._0_8_ = CONCAT44(iVar256,iVar256);
  auVar258 = pmaddwd(auVar259,auVar258);
  local_1c28 = auVar264._0_4_;
  iStack_1c24 = auVar264._4_4_;
  iStack_1c20 = auVar264._8_4_;
  iStack_1c1c = auVar264._12_4_;
  local_1c48 = auVar262._0_4_;
  iStack_1c44 = auVar262._4_4_;
  iStack_1c40 = auVar262._8_4_;
  iStack_1c3c = auVar262._12_4_;
  local_1c68 = auVar260._0_4_;
  iStack_1c64 = auVar260._4_4_;
  iStack_1c60 = auVar260._8_4_;
  iStack_1c5c = auVar260._12_4_;
  local_1c88 = auVar258._0_4_;
  iStack_1c84 = auVar258._4_4_;
  iStack_1c80 = auVar258._8_4_;
  iStack_1c7c = auVar258._12_4_;
  auVar258 = ZEXT416((uint)(int)in_DL);
  auVar259 = ZEXT416((uint)(int)in_DL);
  auVar260 = ZEXT416((uint)(int)in_DL);
  auVar261 = ZEXT416((uint)(int)in_DL);
  auVar144._4_4_ = iStack_1c24 + iVar235 >> auVar258;
  auVar144._0_4_ = local_1c28 + iVar235 >> auVar258;
  auVar144._12_4_ = iStack_1c1c + iVar235 >> auVar258;
  auVar144._8_4_ = iStack_1c20 + iVar235 >> auVar258;
  auVar143._4_4_ = iStack_1c44 + iVar235 >> auVar259;
  auVar143._0_4_ = local_1c48 + iVar235 >> auVar259;
  auVar143._12_4_ = iStack_1c3c + iVar235 >> auVar259;
  auVar143._8_4_ = iStack_1c40 + iVar235 >> auVar259;
  auVar258 = packssdw(auVar144,auVar143);
  auVar142._4_4_ = iStack_1c64 + iVar235 >> auVar260;
  auVar142._0_4_ = local_1c68 + iVar235 >> auVar260;
  auVar142._12_4_ = iStack_1c5c + iVar235 >> auVar260;
  auVar142._8_4_ = iStack_1c60 + iVar235 >> auVar260;
  auVar141._4_4_ = iStack_1c84 + iVar235 >> auVar261;
  auVar141._0_4_ = local_1c88 + iVar235 >> auVar261;
  auVar141._12_4_ = iStack_1c7c + iVar235 >> auVar261;
  auVar141._8_4_ = iStack_1c80 + iVar235 >> auVar261;
  auVar259 = packssdw(auVar142,auVar141);
  local_4768 = auVar277._0_8_;
  uStack_4760 = auVar277._8_8_;
  *in_RSI = local_4768;
  in_RSI[1] = uStack_4760;
  local_4698 = auVar258._0_8_;
  uStack_4690 = auVar258._8_8_;
  in_RSI[2] = local_4698;
  in_RSI[3] = uStack_4690;
  local_4748 = auVar279._0_8_;
  uStack_4740 = auVar279._8_8_;
  in_RSI[4] = local_4748;
  in_RSI[5] = uStack_4740;
  local_46b8 = auVar266._0_8_;
  uStack_46b0 = auVar266._8_8_;
  in_RSI[6] = local_46b8;
  in_RSI[7] = uStack_46b0;
  local_4728 = auVar281._0_8_;
  uStack_4720 = auVar281._8_8_;
  in_RSI[8] = local_4728;
  in_RSI[9] = uStack_4720;
  local_46d8 = auVar274._0_8_;
  uStack_46d0 = auVar274._8_8_;
  in_RSI[10] = local_46d8;
  in_RSI[0xb] = uStack_46d0;
  local_4708 = auVar283._0_8_;
  uStack_4700 = auVar283._8_8_;
  in_RSI[0xc] = local_4708;
  in_RSI[0xd] = uStack_4700;
  local_46f8 = auVar284._0_8_;
  uStack_46f0 = auVar284._8_8_;
  in_RSI[0xe] = local_46f8;
  in_RSI[0xf] = uStack_46f0;
  local_46e8 = auVar285._0_8_;
  uStack_46e0 = auVar285._8_8_;
  in_RSI[0x10] = local_46e8;
  in_RSI[0x11] = uStack_46e0;
  local_4718 = auVar282._0_8_;
  uStack_4710 = auVar282._8_8_;
  in_RSI[0x12] = local_4718;
  in_RSI[0x13] = uStack_4710;
  local_46c8 = auVar275._0_8_;
  uStack_46c0 = auVar275._8_8_;
  in_RSI[0x14] = local_46c8;
  in_RSI[0x15] = uStack_46c0;
  local_4738 = auVar280._0_8_;
  uStack_4730 = auVar280._8_8_;
  in_RSI[0x16] = local_4738;
  in_RSI[0x17] = uStack_4730;
  local_46a8 = auVar267._0_8_;
  uStack_46a0 = auVar267._8_8_;
  in_RSI[0x18] = local_46a8;
  in_RSI[0x19] = uStack_46a0;
  local_4758 = auVar278._0_8_;
  uStack_4750 = auVar278._8_8_;
  in_RSI[0x1a] = local_4758;
  in_RSI[0x1b] = uStack_4750;
  local_4688 = auVar259._0_8_;
  uStack_4680 = auVar259._8_8_;
  in_RSI[0x1c] = local_4688;
  in_RSI[0x1d] = uStack_4680;
  local_4778 = auVar276._0_8_;
  uStack_4770 = auVar276._8_8_;
  in_RSI[0x1e] = local_4778;
  in_RSI[0x1f] = uStack_4770;
  return;
}

Assistant:

static void fadst8x16_new_sse2(const __m128i *input, __m128i *output,
                               int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m128i __zero = _mm_setzero_si128();
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));

  __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  __m128i cospi_m56_p08 = pair_set_epi16(-cospi[56], cospi[8]);
  __m128i cospi_m24_p40 = pair_set_epi16(-cospi[24], cospi[40]);
  __m128i cospi_p02_p62 = pair_set_epi16(cospi[2], cospi[62]);
  __m128i cospi_p62_m02 = pair_set_epi16(cospi[62], -cospi[2]);
  __m128i cospi_p10_p54 = pair_set_epi16(cospi[10], cospi[54]);
  __m128i cospi_p54_m10 = pair_set_epi16(cospi[54], -cospi[10]);
  __m128i cospi_p18_p46 = pair_set_epi16(cospi[18], cospi[46]);
  __m128i cospi_p46_m18 = pair_set_epi16(cospi[46], -cospi[18]);
  __m128i cospi_p26_p38 = pair_set_epi16(cospi[26], cospi[38]);
  __m128i cospi_p38_m26 = pair_set_epi16(cospi[38], -cospi[26]);
  __m128i cospi_p34_p30 = pair_set_epi16(cospi[34], cospi[30]);
  __m128i cospi_p30_m34 = pair_set_epi16(cospi[30], -cospi[34]);
  __m128i cospi_p42_p22 = pair_set_epi16(cospi[42], cospi[22]);
  __m128i cospi_p22_m42 = pair_set_epi16(cospi[22], -cospi[42]);
  __m128i cospi_p50_p14 = pair_set_epi16(cospi[50], cospi[14]);
  __m128i cospi_p14_m50 = pair_set_epi16(cospi[14], -cospi[50]);
  __m128i cospi_p58_p06 = pair_set_epi16(cospi[58], cospi[6]);
  __m128i cospi_p06_m58 = pair_set_epi16(cospi[6], -cospi[58]);

  // stage 1
  __m128i x1[16];
  x1[0] = input[0];
  x1[1] = _mm_subs_epi16(__zero, input[15]);
  x1[2] = _mm_subs_epi16(__zero, input[7]);
  x1[3] = input[8];
  x1[4] = _mm_subs_epi16(__zero, input[3]);
  x1[5] = input[12];
  x1[6] = input[4];
  x1[7] = _mm_subs_epi16(__zero, input[11]);
  x1[8] = _mm_subs_epi16(__zero, input[1]);
  x1[9] = input[14];
  x1[10] = input[6];
  x1[11] = _mm_subs_epi16(__zero, input[9]);
  x1[12] = input[2];
  x1[13] = _mm_subs_epi16(__zero, input[13]);
  x1[14] = _mm_subs_epi16(__zero, input[5]);
  x1[15] = input[10];

  // stage 2
  __m128i x2[16];
  x2[0] = x1[0];
  x2[1] = x1[1];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x1[2], x1[3], x2[2], x2[3]);
  x2[4] = x1[4];
  x2[5] = x1[5];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x1[6], x1[7], x2[6], x2[7]);
  x2[8] = x1[8];
  x2[9] = x1[9];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x1[10], x1[11], x2[10], x2[11]);
  x2[12] = x1[12];
  x2[13] = x1[13];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x1[14], x1[15], x2[14], x2[15]);

  // stage 3
  __m128i x3[16];
  x3[0] = _mm_adds_epi16(x2[0], x2[2]);
  x3[2] = _mm_subs_epi16(x2[0], x2[2]);
  x3[1] = _mm_adds_epi16(x2[1], x2[3]);
  x3[3] = _mm_subs_epi16(x2[1], x2[3]);
  x3[4] = _mm_adds_epi16(x2[4], x2[6]);
  x3[6] = _mm_subs_epi16(x2[4], x2[6]);
  x3[5] = _mm_adds_epi16(x2[5], x2[7]);
  x3[7] = _mm_subs_epi16(x2[5], x2[7]);
  x3[8] = _mm_adds_epi16(x2[8], x2[10]);
  x3[10] = _mm_subs_epi16(x2[8], x2[10]);
  x3[9] = _mm_adds_epi16(x2[9], x2[11]);
  x3[11] = _mm_subs_epi16(x2[9], x2[11]);
  x3[12] = _mm_adds_epi16(x2[12], x2[14]);
  x3[14] = _mm_subs_epi16(x2[12], x2[14]);
  x3[13] = _mm_adds_epi16(x2[13], x2[15]);
  x3[15] = _mm_subs_epi16(x2[13], x2[15]);

  // stage 4
  __m128i x4[16];
  x4[0] = x3[0];
  x4[1] = x3[1];
  x4[2] = x3[2];
  x4[3] = x3[3];
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x3[4], x3[5], x4[4], x4[5]);
  btf_16_sse2(cospi_m48_p16, cospi_p16_p48, x3[6], x3[7], x4[6], x4[7]);
  x4[8] = x3[8];
  x4[9] = x3[9];
  x4[10] = x3[10];
  x4[11] = x3[11];
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x3[12], x3[13], x4[12], x4[13]);
  btf_16_sse2(cospi_m48_p16, cospi_p16_p48, x3[14], x3[15], x4[14], x4[15]);

  // stage 5
  __m128i x5[16];
  x5[0] = _mm_adds_epi16(x4[0], x4[4]);
  x5[4] = _mm_subs_epi16(x4[0], x4[4]);
  x5[1] = _mm_adds_epi16(x4[1], x4[5]);
  x5[5] = _mm_subs_epi16(x4[1], x4[5]);
  x5[2] = _mm_adds_epi16(x4[2], x4[6]);
  x5[6] = _mm_subs_epi16(x4[2], x4[6]);
  x5[3] = _mm_adds_epi16(x4[3], x4[7]);
  x5[7] = _mm_subs_epi16(x4[3], x4[7]);
  x5[8] = _mm_adds_epi16(x4[8], x4[12]);
  x5[12] = _mm_subs_epi16(x4[8], x4[12]);
  x5[9] = _mm_adds_epi16(x4[9], x4[13]);
  x5[13] = _mm_subs_epi16(x4[9], x4[13]);
  x5[10] = _mm_adds_epi16(x4[10], x4[14]);
  x5[14] = _mm_subs_epi16(x4[10], x4[14]);
  x5[11] = _mm_adds_epi16(x4[11], x4[15]);
  x5[15] = _mm_subs_epi16(x4[11], x4[15]);

  // stage 6
  __m128i x6[16];
  x6[0] = x5[0];
  x6[1] = x5[1];
  x6[2] = x5[2];
  x6[3] = x5[3];
  x6[4] = x5[4];
  x6[5] = x5[5];
  x6[6] = x5[6];
  x6[7] = x5[7];
  btf_16_sse2(cospi_p08_p56, cospi_p56_m08, x5[8], x5[9], x6[8], x6[9]);
  btf_16_sse2(cospi_p40_p24, cospi_p24_m40, x5[10], x5[11], x6[10], x6[11]);
  btf_16_sse2(cospi_m56_p08, cospi_p08_p56, x5[12], x5[13], x6[12], x6[13]);
  btf_16_sse2(cospi_m24_p40, cospi_p40_p24, x5[14], x5[15], x6[14], x6[15]);

  // stage 7
  __m128i x7[16];
  x7[0] = _mm_adds_epi16(x6[0], x6[8]);
  x7[8] = _mm_subs_epi16(x6[0], x6[8]);
  x7[1] = _mm_adds_epi16(x6[1], x6[9]);
  x7[9] = _mm_subs_epi16(x6[1], x6[9]);
  x7[2] = _mm_adds_epi16(x6[2], x6[10]);
  x7[10] = _mm_subs_epi16(x6[2], x6[10]);
  x7[3] = _mm_adds_epi16(x6[3], x6[11]);
  x7[11] = _mm_subs_epi16(x6[3], x6[11]);
  x7[4] = _mm_adds_epi16(x6[4], x6[12]);
  x7[12] = _mm_subs_epi16(x6[4], x6[12]);
  x7[5] = _mm_adds_epi16(x6[5], x6[13]);
  x7[13] = _mm_subs_epi16(x6[5], x6[13]);
  x7[6] = _mm_adds_epi16(x6[6], x6[14]);
  x7[14] = _mm_subs_epi16(x6[6], x6[14]);
  x7[7] = _mm_adds_epi16(x6[7], x6[15]);
  x7[15] = _mm_subs_epi16(x6[7], x6[15]);

  // stage 8
  __m128i x8[16];
  btf_16_sse2(cospi_p02_p62, cospi_p62_m02, x7[0], x7[1], x8[0], x8[1]);
  btf_16_sse2(cospi_p10_p54, cospi_p54_m10, x7[2], x7[3], x8[2], x8[3]);
  btf_16_sse2(cospi_p18_p46, cospi_p46_m18, x7[4], x7[5], x8[4], x8[5]);
  btf_16_sse2(cospi_p26_p38, cospi_p38_m26, x7[6], x7[7], x8[6], x8[7]);
  btf_16_sse2(cospi_p34_p30, cospi_p30_m34, x7[8], x7[9], x8[8], x8[9]);
  btf_16_sse2(cospi_p42_p22, cospi_p22_m42, x7[10], x7[11], x8[10], x8[11]);
  btf_16_sse2(cospi_p50_p14, cospi_p14_m50, x7[12], x7[13], x8[12], x8[13]);
  btf_16_sse2(cospi_p58_p06, cospi_p06_m58, x7[14], x7[15], x8[14], x8[15]);

  // stage 9
  output[0] = x8[1];
  output[1] = x8[14];
  output[2] = x8[3];
  output[3] = x8[12];
  output[4] = x8[5];
  output[5] = x8[10];
  output[6] = x8[7];
  output[7] = x8[8];
  output[8] = x8[9];
  output[9] = x8[6];
  output[10] = x8[11];
  output[11] = x8[4];
  output[12] = x8[13];
  output[13] = x8[2];
  output[14] = x8[15];
  output[15] = x8[0];
}